

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  Geometry *pGVar5;
  long lVar6;
  __int_type_conflict _Var7;
  RTCFilterFunctionN p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [28];
  undefined1 auVar22 [28];
  undefined1 auVar23 [28];
  undefined1 auVar24 [28];
  bool bVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  ulong uVar37;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  ulong uVar42;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar51 [16];
  undefined1 auVar78 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar61 [16];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  float t1;
  float fVar123;
  undefined4 uVar124;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar136;
  float fVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vfloat4 a0_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vfloat4 b0;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  vfloat4 a0_3;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  __m128 a_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  __m128 a;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar211;
  float fVar212;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar213;
  float fVar222;
  float fVar223;
  vfloat4 a0_1;
  float fVar224;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar225;
  float fVar233;
  float fVar234;
  vfloat4 a0;
  undefined1 auVar226 [16];
  float fVar235;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_388 [16];
  RayQueryContext *local_370;
  ulong local_368;
  long local_360;
  RTCFilterFunctionNArguments local_358;
  undefined1 local_328 [16];
  uint auStack_318 [4];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined8 uStack_128;
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar32;
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar109 [32];
  uint uVar113;
  undefined1 auVar239 [32];
  
  PVar4 = prim[1];
  uVar42 = (ulong)(byte)PVar4;
  fVar137 = *(float *)(prim + uVar42 * 0x19 + 0x12);
  auVar43 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar43 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar47 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar51 = vinsertps_avx(auVar47,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar45 = vsubps_avx(auVar43,*(undefined1 (*) [16])(prim + uVar42 * 0x19 + 6));
  fVar136 = fVar137 * auVar45._0_4_;
  fVar114 = fVar137 * auVar51._0_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar42 * 4 + 6);
  auVar75 = vpmovsxbd_avx2(auVar43);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar42 * 5 + 6);
  auVar73 = vpmovsxbd_avx2(auVar47);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar42 * 6 + 6);
  auVar80 = vpmovsxbd_avx2(auVar3);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar42 * 0xb + 6);
  auVar90 = vpmovsxbd_avx2(auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar84 = vpmovsxbd_avx2(auVar53);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar84);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar42 + 6);
  auVar74 = vpmovsxbd_avx2(auVar49);
  auVar74 = vcvtdq2ps_avx(auVar74);
  uVar37 = (ulong)(uint)((int)(uVar42 * 9) * 2);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar37 + 6);
  auVar81 = vpmovsxbd_avx2(auVar50);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar37 + uVar42 + 6);
  auVar82 = vpmovsxbd_avx2(auVar44);
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar31 = (ulong)(uint)((int)(uVar42 * 5) << 2);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar31 + 6);
  auVar72 = vpmovsxbd_avx2(auVar48);
  auVar83 = vcvtdq2ps_avx(auVar72);
  auVar155._4_4_ = fVar114;
  auVar155._0_4_ = fVar114;
  auVar155._8_4_ = fVar114;
  auVar155._12_4_ = fVar114;
  auVar155._16_4_ = fVar114;
  auVar155._20_4_ = fVar114;
  auVar155._24_4_ = fVar114;
  auVar155._28_4_ = fVar114;
  auVar246._8_4_ = 1;
  auVar246._0_8_ = 0x100000001;
  auVar246._12_4_ = 1;
  auVar246._16_4_ = 1;
  auVar246._20_4_ = 1;
  auVar246._24_4_ = 1;
  auVar246._28_4_ = 1;
  auVar70 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar254 = ZEXT3264(auVar70);
  auVar86 = ZEXT1632(CONCAT412(fVar137 * auVar51._12_4_,
                               CONCAT48(fVar137 * auVar51._8_4_,
                                        CONCAT44(fVar137 * auVar51._4_4_,fVar114))));
  auVar85 = vpermps_avx2(auVar246,auVar86);
  auVar71 = vpermps_avx512vl(auVar70,auVar86);
  fVar114 = auVar71._0_4_;
  fVar202 = auVar71._4_4_;
  auVar86._4_4_ = fVar202 * auVar80._4_4_;
  auVar86._0_4_ = fVar114 * auVar80._0_4_;
  fVar211 = auVar71._8_4_;
  auVar86._8_4_ = fVar211 * auVar80._8_4_;
  fVar212 = auVar71._12_4_;
  auVar86._12_4_ = fVar212 * auVar80._12_4_;
  fVar120 = auVar71._16_4_;
  auVar86._16_4_ = fVar120 * auVar80._16_4_;
  fVar121 = auVar71._20_4_;
  auVar86._20_4_ = fVar121 * auVar80._20_4_;
  fVar122 = auVar71._24_4_;
  auVar86._24_4_ = fVar122 * auVar80._24_4_;
  auVar86._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar74._4_4_ * fVar202;
  auVar84._0_4_ = auVar74._0_4_ * fVar114;
  auVar84._8_4_ = auVar74._8_4_ * fVar211;
  auVar84._12_4_ = auVar74._12_4_ * fVar212;
  auVar84._16_4_ = auVar74._16_4_ * fVar120;
  auVar84._20_4_ = auVar74._20_4_ * fVar121;
  auVar84._24_4_ = auVar74._24_4_ * fVar122;
  auVar84._28_4_ = auVar72._28_4_;
  auVar72._4_4_ = auVar83._4_4_ * fVar202;
  auVar72._0_4_ = auVar83._0_4_ * fVar114;
  auVar72._8_4_ = auVar83._8_4_ * fVar211;
  auVar72._12_4_ = auVar83._12_4_ * fVar212;
  auVar72._16_4_ = auVar83._16_4_ * fVar120;
  auVar72._20_4_ = auVar83._20_4_ * fVar121;
  auVar72._24_4_ = auVar83._24_4_ * fVar122;
  auVar72._28_4_ = auVar71._28_4_;
  auVar43 = vfmadd231ps_fma(auVar86,auVar85,auVar73);
  auVar47 = vfmadd231ps_fma(auVar84,auVar85,auVar91);
  auVar3 = vfmadd231ps_fma(auVar72,auVar82,auVar85);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar155,auVar75);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar155,auVar90);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar81,auVar155);
  auVar232._4_4_ = fVar136;
  auVar232._0_4_ = fVar136;
  auVar232._8_4_ = fVar136;
  auVar232._12_4_ = fVar136;
  auVar232._16_4_ = fVar136;
  auVar232._20_4_ = fVar136;
  auVar232._24_4_ = fVar136;
  auVar232._28_4_ = fVar136;
  auVar72 = ZEXT1632(CONCAT412(fVar137 * auVar45._12_4_,
                               CONCAT48(fVar137 * auVar45._8_4_,
                                        CONCAT44(fVar137 * auVar45._4_4_,fVar136))));
  auVar84 = vpermps_avx2(auVar246,auVar72);
  auVar72 = vpermps_avx512vl(auVar70,auVar72);
  fVar137 = auVar72._0_4_;
  fVar114 = auVar72._4_4_;
  auVar85._4_4_ = fVar114 * auVar80._4_4_;
  auVar85._0_4_ = fVar137 * auVar80._0_4_;
  fVar202 = auVar72._8_4_;
  auVar85._8_4_ = fVar202 * auVar80._8_4_;
  fVar211 = auVar72._12_4_;
  auVar85._12_4_ = fVar211 * auVar80._12_4_;
  fVar212 = auVar72._16_4_;
  auVar85._16_4_ = fVar212 * auVar80._16_4_;
  fVar120 = auVar72._20_4_;
  auVar85._20_4_ = fVar120 * auVar80._20_4_;
  fVar121 = auVar72._24_4_;
  auVar85._24_4_ = fVar121 * auVar80._24_4_;
  auVar85._28_4_ = 1;
  auVar70._4_4_ = auVar74._4_4_ * fVar114;
  auVar70._0_4_ = auVar74._0_4_ * fVar137;
  auVar70._8_4_ = auVar74._8_4_ * fVar202;
  auVar70._12_4_ = auVar74._12_4_ * fVar211;
  auVar70._16_4_ = auVar74._16_4_ * fVar212;
  auVar70._20_4_ = auVar74._20_4_ * fVar120;
  auVar70._24_4_ = auVar74._24_4_ * fVar121;
  auVar70._28_4_ = auVar80._28_4_;
  auVar74._4_4_ = auVar83._4_4_ * fVar114;
  auVar74._0_4_ = auVar83._0_4_ * fVar137;
  auVar74._8_4_ = auVar83._8_4_ * fVar202;
  auVar74._12_4_ = auVar83._12_4_ * fVar211;
  auVar74._16_4_ = auVar83._16_4_ * fVar212;
  auVar74._20_4_ = auVar83._20_4_ * fVar120;
  auVar74._24_4_ = auVar83._24_4_ * fVar121;
  auVar74._28_4_ = auVar72._28_4_;
  auVar52 = vfmadd231ps_fma(auVar85,auVar84,auVar73);
  auVar53 = vfmadd231ps_fma(auVar70,auVar84,auVar91);
  auVar49 = vfmadd231ps_fma(auVar74,auVar84,auVar82);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar232,auVar75);
  auVar53 = vfmadd231ps_fma(ZEXT1632(auVar53),auVar232,auVar90);
  auVar93._8_4_ = 0x7fffffff;
  auVar93._0_8_ = 0x7fffffff7fffffff;
  auVar93._12_4_ = 0x7fffffff;
  auVar93._16_4_ = 0x7fffffff;
  auVar93._20_4_ = 0x7fffffff;
  auVar93._24_4_ = 0x7fffffff;
  auVar93._28_4_ = 0x7fffffff;
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar232,auVar81);
  auVar75 = vandps_avx(ZEXT1632(auVar43),auVar93);
  auVar147._8_4_ = 0x219392ef;
  auVar147._0_8_ = 0x219392ef219392ef;
  auVar147._12_4_ = 0x219392ef;
  auVar147._16_4_ = 0x219392ef;
  auVar147._20_4_ = 0x219392ef;
  auVar147._24_4_ = 0x219392ef;
  auVar147._28_4_ = 0x219392ef;
  uVar37 = vcmpps_avx512vl(auVar75,auVar147,1);
  bVar40 = (bool)((byte)uVar37 & 1);
  auVar71._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._0_4_;
  bVar40 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar71._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._4_4_;
  bVar40 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar71._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._8_4_;
  bVar40 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar71._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar43._12_4_;
  auVar71._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar71._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar71._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar71._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar47),auVar93);
  uVar37 = vcmpps_avx512vl(auVar75,auVar147,1);
  bVar40 = (bool)((byte)uVar37 & 1);
  auVar87._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar47._0_4_;
  bVar40 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar47._4_4_;
  bVar40 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar47._8_4_;
  bVar40 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar47._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar3),auVar93);
  uVar37 = vcmpps_avx512vl(auVar75,auVar147,1);
  bVar40 = (bool)((byte)uVar37 & 1);
  auVar75._0_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar3._0_4_;
  bVar40 = (bool)((byte)(uVar37 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar3._4_4_;
  bVar40 = (bool)((byte)(uVar37 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar3._8_4_;
  bVar40 = (bool)((byte)(uVar37 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar40 * 0x219392ef | (uint)!bVar40 * auVar3._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar37 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar37 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar37 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar37 >> 7) * 0x219392ef;
  auVar73 = vrcp14ps_avx512vl(auVar71);
  auVar94._8_4_ = 0x3f800000;
  auVar94._0_8_ = 0x3f8000003f800000;
  auVar94._12_4_ = 0x3f800000;
  auVar94._16_4_ = 0x3f800000;
  auVar94._20_4_ = 0x3f800000;
  auVar94._24_4_ = 0x3f800000;
  auVar94._28_4_ = 0x3f800000;
  auVar43 = vfnmadd213ps_fma(auVar71,auVar73,auVar94);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar87);
  auVar47 = vfnmadd213ps_fma(auVar87,auVar73,auVar94);
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar73,auVar73);
  auVar73 = vrcp14ps_avx512vl(auVar75);
  auVar3 = vfnmadd213ps_fma(auVar75,auVar73,auVar94);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar73,auVar73);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 7 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar52));
  auVar81._4_4_ = auVar43._4_4_ * auVar75._4_4_;
  auVar81._0_4_ = auVar43._0_4_ * auVar75._0_4_;
  auVar81._8_4_ = auVar43._8_4_ * auVar75._8_4_;
  auVar81._12_4_ = auVar43._12_4_ * auVar75._12_4_;
  auVar81._16_4_ = auVar75._16_4_ * 0.0;
  auVar81._20_4_ = auVar75._20_4_ * 0.0;
  auVar81._24_4_ = auVar75._24_4_ * 0.0;
  auVar81._28_4_ = auVar75._28_4_;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 9 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar52));
  auVar74 = vpbroadcastd_avx512vl();
  auVar73 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar92._0_4_ = auVar43._0_4_ * auVar75._0_4_;
  auVar92._4_4_ = auVar43._4_4_ * auVar75._4_4_;
  auVar92._8_4_ = auVar43._8_4_ * auVar75._8_4_;
  auVar92._12_4_ = auVar43._12_4_ * auVar75._12_4_;
  auVar92._16_4_ = auVar75._16_4_ * 0.0;
  auVar92._20_4_ = auVar75._20_4_ * 0.0;
  auVar92._24_4_ = auVar75._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar42 * -2 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar53));
  auVar82._4_4_ = auVar47._4_4_ * auVar75._4_4_;
  auVar82._0_4_ = auVar47._0_4_ * auVar75._0_4_;
  auVar82._8_4_ = auVar47._8_4_ * auVar75._8_4_;
  auVar82._12_4_ = auVar47._12_4_ * auVar75._12_4_;
  auVar82._16_4_ = auVar75._16_4_ * 0.0;
  auVar82._20_4_ = auVar75._20_4_ * 0.0;
  auVar82._24_4_ = auVar75._24_4_ * 0.0;
  auVar82._28_4_ = auVar75._28_4_;
  auVar75 = vcvtdq2ps_avx(auVar73);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar53));
  auVar89._0_4_ = auVar47._0_4_ * auVar75._0_4_;
  auVar89._4_4_ = auVar47._4_4_ * auVar75._4_4_;
  auVar89._8_4_ = auVar47._8_4_ * auVar75._8_4_;
  auVar89._12_4_ = auVar47._12_4_ * auVar75._12_4_;
  auVar89._16_4_ = auVar75._16_4_ * 0.0;
  auVar89._20_4_ = auVar75._20_4_ * 0.0;
  auVar89._24_4_ = auVar75._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + uVar42 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar49));
  auVar83._4_4_ = auVar75._4_4_ * auVar3._4_4_;
  auVar83._0_4_ = auVar75._0_4_ * auVar3._0_4_;
  auVar83._8_4_ = auVar75._8_4_ * auVar3._8_4_;
  auVar83._12_4_ = auVar75._12_4_ * auVar3._12_4_;
  auVar83._16_4_ = auVar75._16_4_ * 0.0;
  auVar83._20_4_ = auVar75._20_4_ * 0.0;
  auVar83._24_4_ = auVar75._24_4_ * 0.0;
  auVar83._28_4_ = auVar75._28_4_;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 * 0x17 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar75 = vsubps_avx(auVar75,ZEXT1632(auVar49));
  auVar88._0_4_ = auVar3._0_4_ * auVar75._0_4_;
  auVar88._4_4_ = auVar3._4_4_ * auVar75._4_4_;
  auVar88._8_4_ = auVar3._8_4_ * auVar75._8_4_;
  auVar88._12_4_ = auVar3._12_4_ * auVar75._12_4_;
  auVar88._16_4_ = auVar75._16_4_ * 0.0;
  auVar88._20_4_ = auVar75._20_4_ * 0.0;
  auVar88._24_4_ = auVar75._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar75 = vpminsd_avx2(auVar81,auVar92);
  auVar73 = vpminsd_avx2(auVar82,auVar89);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar73 = vpminsd_avx2(auVar83,auVar88);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar80._4_4_ = uVar124;
  auVar80._0_4_ = uVar124;
  auVar80._8_4_ = uVar124;
  auVar80._12_4_ = uVar124;
  auVar80._16_4_ = uVar124;
  auVar80._20_4_ = uVar124;
  auVar80._24_4_ = uVar124;
  auVar80._28_4_ = uVar124;
  auVar73 = vmaxps_avx512vl(auVar73,auVar80);
  auVar75 = vmaxps_avx(auVar75,auVar73);
  auVar73._8_4_ = 0x3f7ffffa;
  auVar73._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar73._12_4_ = 0x3f7ffffa;
  auVar73._16_4_ = 0x3f7ffffa;
  auVar73._20_4_ = 0x3f7ffffa;
  auVar73._24_4_ = 0x3f7ffffa;
  auVar73._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar75,auVar73);
  auVar75 = vpmaxsd_avx2(auVar81,auVar92);
  auVar73 = vpmaxsd_avx2(auVar82,auVar89);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar73 = vpmaxsd_avx2(auVar83,auVar88);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar90._4_4_ = uVar124;
  auVar90._0_4_ = uVar124;
  auVar90._8_4_ = uVar124;
  auVar90._12_4_ = uVar124;
  auVar90._16_4_ = uVar124;
  auVar90._20_4_ = uVar124;
  auVar90._24_4_ = uVar124;
  auVar90._28_4_ = uVar124;
  auVar73 = vminps_avx512vl(auVar73,auVar90);
  auVar75 = vminps_avx(auVar75,auVar73);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar91);
  uVar10 = vpcmpgtd_avx512vl(auVar74,_DAT_01fe9900);
  uVar9 = vcmpps_avx512vl(local_78,auVar75,2);
  if ((byte)((byte)uVar9 & (byte)uVar10) != 0) {
    uVar37 = (ulong)(byte)((byte)uVar9 & (byte)uVar10);
    local_308 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar108._16_16_ = auVar75._16_16_;
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar247 = ZEXT1664(auVar43);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar249 = ZEXT1664(auVar43);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar250 = ZEXT1664(auVar43);
    auVar256 = ZEXT464(0x3f800000);
    auVar108._0_16_ = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
    auVar255 = ZEXT1664(auVar108._0_16_);
    do {
      lVar33 = 0;
      for (uVar31 = uVar37; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
        lVar33 = lVar33 + 1;
      }
      uVar36 = *(uint *)(prim + 2);
      local_368 = (ulong)*(uint *)(prim + lVar33 * 4 + 6);
      pGVar5 = (context->scene->geometries).items[uVar36].ptr;
      lVar6 = *(long *)&pGVar5[1].time_range.upper;
      uVar31 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                               local_368 *
                               pGVar5[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar43 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * uVar31);
      lVar33 = uVar31 + 1;
      auVar47 = *(undefined1 (*) [16])(lVar6 + (long)pGVar5[1].intersectionFilterN * lVar33);
      _Var7 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar3 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * uVar31);
      auVar52 = *(undefined1 (*) [16])(_Var7 + (long)pGVar5[2].userPtr * lVar33);
      auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      fVar137 = *(float *)(ray + k * 4 + 0x30);
      auVar240._8_4_ = 0x3eaaaaab;
      auVar240._0_8_ = 0x3eaaaaab3eaaaaab;
      auVar240._12_4_ = 0x3eaaaaab;
      auVar49 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar5[2].intersectionFilterN +
                                 (long)pGVar5[2].pointQueryFunc * uVar31),auVar43,auVar240);
      auVar48 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (pGVar5[2].intersectionFilterN +
                                  (long)pGVar5[2].pointQueryFunc * lVar33),auVar47,auVar240);
      auVar50 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 ((long)pGVar5[3].userPtr +
                                 uVar31 * *(long *)&pGVar5[3].fnumTimeSegments),auVar3,auVar240);
      auVar51 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  ((long)pGVar5[3].userPtr +
                                  *(long *)&pGVar5[3].fnumTimeSegments * lVar33),auVar52,auVar240);
      auVar77._16_16_ = auVar108._16_16_;
      auVar77._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
      auVar44 = vmulps_avx512vl(auVar47,auVar77._0_16_);
      auVar45 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar77._0_16_);
      auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar49,auVar45);
      auVar54._0_4_ = auVar43._0_4_ + auVar44._0_4_;
      auVar54._4_4_ = auVar43._4_4_ + auVar44._4_4_;
      auVar54._8_4_ = auVar43._8_4_ + auVar44._8_4_;
      auVar54._12_4_ = auVar43._12_4_ + auVar44._12_4_;
      auVar125 = auVar247._0_16_;
      auVar44 = vfmadd231ps_avx512vl(auVar45,auVar49,auVar125);
      auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar43,auVar125);
      auVar44 = vmulps_avx512vl(auVar52,auVar77._0_16_);
      auVar46 = vfmadd231ps_avx512vl(auVar44,auVar51,auVar77._0_16_);
      auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar50,auVar46);
      auVar226._0_4_ = auVar3._0_4_ + auVar44._0_4_;
      auVar226._4_4_ = auVar3._4_4_ + auVar44._4_4_;
      auVar226._8_4_ = auVar3._8_4_ + auVar44._8_4_;
      auVar226._12_4_ = auVar3._12_4_ + auVar44._12_4_;
      auVar44 = vfmadd231ps_avx512vl(auVar46,auVar50,auVar125);
      auVar46 = vfnmadd231ps_avx512vl(auVar44,auVar3,auVar125);
      auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar48,auVar47);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar49,auVar77._0_16_);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar43,auVar77._0_16_);
      auVar47 = vmulps_avx512vl(auVar47,auVar125);
      auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar125,auVar48);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar77._0_16_,auVar49);
      auVar48 = vfnmadd231ps_avx512vl(auVar47,auVar77._0_16_,auVar43);
      auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar51,auVar52);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar77._0_16_);
      auVar49 = vfmadd231ps_avx512vl(auVar43,auVar3,auVar77._0_16_);
      auVar43 = vmulps_avx512vl(auVar52,auVar125);
      auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar125,auVar51);
      auVar43 = vfmadd231ps_avx512vl(auVar43,auVar77._0_16_,auVar50);
      auVar50 = vfnmadd231ps_avx512vl(auVar43,auVar77._0_16_,auVar3);
      auVar43 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar47 = vshufps_avx(auVar226,auVar226,0xc9);
      fVar123 = auVar45._0_4_;
      auVar67._0_4_ = fVar123 * auVar47._0_4_;
      fVar128 = auVar45._4_4_;
      auVar67._4_4_ = fVar128 * auVar47._4_4_;
      fVar129 = auVar45._8_4_;
      auVar67._8_4_ = fVar129 * auVar47._8_4_;
      fVar130 = auVar45._12_4_;
      auVar67._12_4_ = fVar130 * auVar47._12_4_;
      auVar47 = vfmsub231ps_fma(auVar67,auVar43,auVar226);
      auVar3 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vshufps_avx(auVar46,auVar46,0xc9);
      auVar181._0_4_ = auVar47._0_4_ * fVar123;
      auVar181._4_4_ = auVar47._4_4_ * fVar128;
      auVar181._8_4_ = auVar47._8_4_ * fVar129;
      auVar181._12_4_ = auVar47._12_4_ * fVar130;
      auVar43 = vfmsub231ps_fma(auVar181,auVar43,auVar46);
      auVar52 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vshufps_avx(auVar48,auVar48,0xc9);
      auVar47 = vshufps_avx(auVar49,auVar49,0xc9);
      fVar114 = auVar48._0_4_;
      auVar192._0_4_ = auVar47._0_4_ * fVar114;
      fVar202 = auVar48._4_4_;
      auVar192._4_4_ = auVar47._4_4_ * fVar202;
      fVar211 = auVar48._8_4_;
      auVar192._8_4_ = auVar47._8_4_ * fVar211;
      fVar212 = auVar48._12_4_;
      auVar192._12_4_ = auVar47._12_4_ * fVar212;
      auVar47 = vfmsub231ps_fma(auVar192,auVar43,auVar49);
      auVar49 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar47 = vshufps_avx(auVar50,auVar50,0xc9);
      auVar193._0_4_ = auVar47._0_4_ * fVar114;
      auVar193._4_4_ = auVar47._4_4_ * fVar202;
      auVar193._8_4_ = auVar47._8_4_ * fVar211;
      auVar193._12_4_ = auVar47._12_4_ * fVar212;
      auVar43 = vfmsub231ps_fma(auVar193,auVar43,auVar50);
      auVar50 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar43 = vdpps_avx(auVar3,auVar3,0x7f);
      fVar120 = auVar43._0_4_;
      auVar76._4_28_ = auVar77._4_28_;
      auVar76._0_4_ = fVar120;
      auVar47 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar76._0_16_);
      auVar51 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
      auVar46 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
      fVar121 = auVar47._0_4_;
      fVar122 = auVar51._0_4_ - auVar46._0_4_ * fVar121 * fVar121 * fVar121;
      auVar47 = vdpps_avx(auVar3,auVar52,0x7f);
      fVar225 = fVar122 * auVar3._0_4_;
      fVar233 = fVar122 * auVar3._4_4_;
      fVar234 = fVar122 * auVar3._8_4_;
      fVar235 = fVar122 * auVar3._12_4_;
      auVar182._0_4_ = fVar120 * auVar52._0_4_;
      auVar182._4_4_ = fVar120 * auVar52._4_4_;
      auVar182._8_4_ = fVar120 * auVar52._8_4_;
      auVar182._12_4_ = fVar120 * auVar52._12_4_;
      fVar120 = auVar47._0_4_;
      auVar68._0_4_ = fVar120 * auVar3._0_4_;
      auVar68._4_4_ = fVar120 * auVar3._4_4_;
      auVar68._8_4_ = fVar120 * auVar3._8_4_;
      auVar68._12_4_ = fVar120 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar182,auVar68);
      auVar47 = vrcp14ss_avx512f(auVar77._0_16_,auVar76._0_16_);
      auVar43 = vfnmadd213ss_avx512f(auVar43,auVar47,ZEXT416(0x40000000));
      fVar120 = auVar47._0_4_ * auVar43._0_4_;
      auVar43 = vdpps_avx(auVar49,auVar49,0x7f);
      fVar121 = auVar43._0_4_;
      auVar79._16_16_ = auVar77._16_16_;
      auVar79._0_16_ = auVar77._0_16_;
      auVar78._4_28_ = auVar79._4_28_;
      auVar78._0_4_ = fVar121;
      auVar47 = vrsqrt14ss_avx512f(auVar77._0_16_,auVar78._0_16_);
      auVar52 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
      auVar51 = vmulss_avx512f(auVar43,ZEXT416(0x3f000000));
      fVar136 = auVar47._0_4_;
      fVar136 = auVar52._0_4_ - auVar51._0_4_ * fVar136 * fVar136 * fVar136;
      auVar47 = vdpps_avx(auVar49,auVar50,0x7f);
      fVar213 = fVar136 * auVar49._0_4_;
      fVar222 = fVar136 * auVar49._4_4_;
      fVar223 = fVar136 * auVar49._8_4_;
      fVar224 = fVar136 * auVar49._12_4_;
      auVar62._0_4_ = fVar121 * auVar50._0_4_;
      auVar62._4_4_ = fVar121 * auVar50._4_4_;
      auVar62._8_4_ = fVar121 * auVar50._8_4_;
      auVar62._12_4_ = fVar121 * auVar50._12_4_;
      fVar121 = auVar47._0_4_;
      auVar61._0_4_ = fVar121 * auVar49._0_4_;
      auVar61._4_4_ = fVar121 * auVar49._4_4_;
      auVar61._8_4_ = fVar121 * auVar49._8_4_;
      auVar61._12_4_ = fVar121 * auVar49._12_4_;
      auVar52 = vsubps_avx(auVar62,auVar61);
      auVar47 = vrcp14ss_avx512f(auVar77._0_16_,auVar78._0_16_);
      auVar43 = vfnmadd213ss_avx512f(auVar43,auVar47,ZEXT416(0x40000000));
      fVar121 = auVar43._0_4_ * auVar47._0_4_;
      auVar43 = vshufps_avx(auVar54,auVar54,0xff);
      auVar171._0_4_ = fVar225 * auVar43._0_4_;
      auVar171._4_4_ = fVar233 * auVar43._4_4_;
      auVar171._8_4_ = fVar234 * auVar43._8_4_;
      auVar171._12_4_ = fVar235 * auVar43._12_4_;
      local_228 = vsubps_avx(auVar54,auVar171);
      auVar47 = vshufps_avx(auVar45,auVar45,0xff);
      auVar158._0_4_ = auVar47._0_4_ * fVar225 + auVar43._0_4_ * fVar122 * fVar120 * auVar3._0_4_;
      auVar158._4_4_ = auVar47._4_4_ * fVar233 + auVar43._4_4_ * fVar122 * fVar120 * auVar3._4_4_;
      auVar158._8_4_ = auVar47._8_4_ * fVar234 + auVar43._8_4_ * fVar122 * fVar120 * auVar3._8_4_;
      auVar158._12_4_ =
           auVar47._12_4_ * fVar235 + auVar43._12_4_ * fVar122 * fVar120 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar45,auVar158);
      local_238._0_4_ = auVar171._0_4_ + auVar54._0_4_;
      local_238._4_4_ = auVar171._4_4_ + auVar54._4_4_;
      fStack_230 = auVar171._8_4_ + auVar54._8_4_;
      fStack_22c = auVar171._12_4_ + auVar54._12_4_;
      auVar43 = vshufps_avx(auVar44,auVar44,0xff);
      auVar57._0_4_ = fVar213 * auVar43._0_4_;
      auVar57._4_4_ = fVar222 * auVar43._4_4_;
      auVar57._8_4_ = fVar223 * auVar43._8_4_;
      auVar57._12_4_ = fVar224 * auVar43._12_4_;
      local_248 = vsubps_avx512vl(auVar44,auVar57);
      auVar47 = vshufps_avx(auVar48,auVar48,0xff);
      auVar55._0_4_ = auVar47._0_4_ * fVar213 + auVar43._0_4_ * fVar136 * auVar52._0_4_ * fVar121;
      auVar55._4_4_ = auVar47._4_4_ * fVar222 + auVar43._4_4_ * fVar136 * auVar52._4_4_ * fVar121;
      auVar55._8_4_ = auVar47._8_4_ * fVar223 + auVar43._8_4_ * fVar136 * auVar52._8_4_ * fVar121;
      auVar55._12_4_ =
           auVar47._12_4_ * fVar224 + auVar43._12_4_ * fVar136 * auVar52._12_4_ * fVar121;
      auVar43 = vsubps_avx(auVar48,auVar55);
      _local_258 = vaddps_avx512vl(auVar44,auVar57);
      auVar65._0_4_ = auVar3._0_4_ * 0.33333334;
      auVar65._4_4_ = auVar3._4_4_ * 0.33333334;
      auVar65._8_4_ = auVar3._8_4_ * 0.33333334;
      auVar65._12_4_ = auVar3._12_4_ * 0.33333334;
      local_268 = vaddps_avx512vl(local_228,auVar65);
      auVar59._0_4_ = auVar43._0_4_ * 0.33333334;
      auVar59._4_4_ = auVar43._4_4_ * 0.33333334;
      auVar59._8_4_ = auVar43._8_4_ * 0.33333334;
      auVar59._12_4_ = auVar43._12_4_ * 0.33333334;
      local_278 = vsubps_avx512vl(local_248,auVar59);
      auVar45._0_4_ = (fVar123 + auVar158._0_4_) * 0.33333334;
      auVar45._4_4_ = (fVar128 + auVar158._4_4_) * 0.33333334;
      auVar45._8_4_ = (fVar129 + auVar158._8_4_) * 0.33333334;
      auVar45._12_4_ = (fVar130 + auVar158._12_4_) * 0.33333334;
      _local_288 = vaddps_avx512vl(_local_238,auVar45);
      auVar46._0_4_ = (fVar114 + auVar55._0_4_) * 0.33333334;
      auVar46._4_4_ = (fVar202 + auVar55._4_4_) * 0.33333334;
      auVar46._8_4_ = (fVar211 + auVar55._8_4_) * 0.33333334;
      auVar46._12_4_ = (fVar212 + auVar55._12_4_) * 0.33333334;
      _local_298 = vsubps_avx512vl(_local_258,auVar46);
      local_1a8 = vsubps_avx(local_228,auVar53);
      uVar124 = local_1a8._0_4_;
      auVar56._4_4_ = uVar124;
      auVar56._0_4_ = uVar124;
      auVar56._8_4_ = uVar124;
      auVar56._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_1a8,local_1a8,0x55);
      auVar47 = vshufps_avx(local_1a8,local_1a8,0xaa);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      fVar114 = pre->ray_space[k].vz.field_0.m128[0];
      fVar202 = pre->ray_space[k].vz.field_0.m128[1];
      fVar211 = pre->ray_space[k].vz.field_0.m128[2];
      fVar212 = pre->ray_space[k].vz.field_0.m128[3];
      auVar125._0_4_ = fVar114 * auVar47._0_4_;
      auVar125._4_4_ = fVar202 * auVar47._4_4_;
      auVar125._8_4_ = fVar211 * auVar47._8_4_;
      auVar125._12_4_ = fVar212 * auVar47._12_4_;
      auVar43 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar2,auVar43);
      auVar49 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar56);
      local_1b8 = vsubps_avx512vl(local_268,auVar53);
      uVar124 = local_1b8._0_4_;
      auVar60._4_4_ = uVar124;
      auVar60._0_4_ = uVar124;
      auVar60._8_4_ = uVar124;
      auVar60._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_1b8,local_1b8,0x55);
      auVar47 = vshufps_avx(local_1b8,local_1b8,0xaa);
      auVar64._0_4_ = fVar114 * auVar47._0_4_;
      auVar64._4_4_ = fVar202 * auVar47._4_4_;
      auVar64._8_4_ = fVar211 * auVar47._8_4_;
      auVar64._12_4_ = fVar212 * auVar47._12_4_;
      auVar43 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar2,auVar43);
      auVar50 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar60);
      local_1c8 = vsubps_avx512vl(local_278,auVar53);
      uVar124 = local_1c8._0_4_;
      auVar58._4_4_ = uVar124;
      auVar58._0_4_ = uVar124;
      auVar58._8_4_ = uVar124;
      auVar58._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_1c8,local_1c8,0x55);
      auVar47 = vshufps_avx(local_1c8,local_1c8,0xaa);
      auVar63._0_4_ = fVar114 * auVar47._0_4_;
      auVar63._4_4_ = fVar202 * auVar47._4_4_;
      auVar63._8_4_ = fVar211 * auVar47._8_4_;
      auVar63._12_4_ = fVar212 * auVar47._12_4_;
      auVar43 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar43);
      auVar44 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar58);
      local_1d8 = vsubps_avx512vl(local_248,auVar53);
      uVar124 = local_1d8._0_4_;
      auVar172._4_4_ = uVar124;
      auVar172._0_4_ = uVar124;
      auVar172._8_4_ = uVar124;
      auVar172._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_1d8,local_1d8,0x55);
      auVar47 = vshufps_avx(local_1d8,local_1d8,0xaa);
      auVar66._0_4_ = fVar114 * auVar47._0_4_;
      auVar66._4_4_ = fVar202 * auVar47._4_4_;
      auVar66._8_4_ = fVar211 * auVar47._8_4_;
      auVar66._12_4_ = fVar212 * auVar47._12_4_;
      auVar43 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar2,auVar43);
      auVar48 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar172);
      local_1e8 = vsubps_avx(_local_238,auVar53);
      uVar124 = local_1e8._0_4_;
      auVar173._4_4_ = uVar124;
      auVar173._0_4_ = uVar124;
      auVar173._8_4_ = uVar124;
      auVar173._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_1e8,local_1e8,0x55);
      auVar47 = vshufps_avx(local_1e8,local_1e8,0xaa);
      auVar194._0_4_ = auVar47._0_4_ * fVar114;
      auVar194._4_4_ = auVar47._4_4_ * fVar202;
      auVar194._8_4_ = auVar47._8_4_ * fVar211;
      auVar194._12_4_ = auVar47._12_4_ * fVar212;
      auVar43 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar2,auVar43);
      auVar45 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar173);
      local_1f8 = vsubps_avx512vl(_local_288,auVar53);
      uVar124 = local_1f8._0_4_;
      auVar174._4_4_ = uVar124;
      auVar174._0_4_ = uVar124;
      auVar174._8_4_ = uVar124;
      auVar174._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_1f8,local_1f8,0x55);
      auVar47 = vshufps_avx(local_1f8,local_1f8,0xaa);
      auVar203._0_4_ = auVar47._0_4_ * fVar114;
      auVar203._4_4_ = auVar47._4_4_ * fVar202;
      auVar203._8_4_ = auVar47._8_4_ * fVar211;
      auVar203._12_4_ = auVar47._12_4_ * fVar212;
      auVar43 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar2,auVar43);
      auVar46 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar174);
      local_208 = vsubps_avx(_local_298,auVar53);
      uVar124 = local_208._0_4_;
      auVar175._4_4_ = uVar124;
      auVar175._0_4_ = uVar124;
      auVar175._8_4_ = uVar124;
      auVar175._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_208,local_208,0x55);
      auVar47 = vshufps_avx(local_208,local_208,0xaa);
      auVar214._0_4_ = auVar47._0_4_ * fVar114;
      auVar214._4_4_ = auVar47._4_4_ * fVar202;
      auVar214._8_4_ = auVar47._8_4_ * fVar211;
      auVar214._12_4_ = auVar47._12_4_ * fVar212;
      auVar43 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar2,auVar43);
      auVar125 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar175);
      local_218 = vsubps_avx512vl(_local_258,auVar53);
      uVar124 = local_218._0_4_;
      auVar115._4_4_ = uVar124;
      auVar115._0_4_ = uVar124;
      auVar115._8_4_ = uVar124;
      auVar115._12_4_ = uVar124;
      auVar43 = vshufps_avx(local_218,local_218,0x55);
      auVar47 = vshufps_avx(local_218,local_218,0xaa);
      auVar165._0_4_ = auVar47._0_4_ * fVar114;
      auVar165._4_4_ = auVar47._4_4_ * fVar202;
      auVar165._8_4_ = auVar47._8_4_ * fVar211;
      auVar165._12_4_ = auVar47._12_4_ * fVar212;
      auVar43 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar2,auVar43);
      auVar115 = vfmadd231ps_fma(auVar43,(undefined1  [16])aVar1,auVar115);
      auVar3 = vmovlhps_avx(auVar49,auVar45);
      auVar52 = vmovlhps_avx(auVar50,auVar46);
      local_328 = vmovlhps_avx512f(auVar44,auVar125);
      _local_178 = vmovlhps_avx512f(auVar48,auVar115);
      auVar47 = vminps_avx(auVar3,auVar52);
      auVar43 = vmaxps_avx(auVar3,auVar52);
      auVar53 = vminps_avx512vl(local_328,_local_178);
      auVar47 = vminps_avx(auVar47,auVar53);
      auVar53 = vmaxps_avx512vl(local_328,_local_178);
      auVar43 = vmaxps_avx(auVar43,auVar53);
      auVar53 = vshufpd_avx(auVar47,auVar47,3);
      auVar47 = vminps_avx(auVar47,auVar53);
      auVar53 = vshufpd_avx(auVar43,auVar43,3);
      auVar43 = vmaxps_avx(auVar43,auVar53);
      auVar47 = vandps_avx512vl(auVar47,auVar249._0_16_);
      auVar43 = vandps_avx512vl(auVar43,auVar249._0_16_);
      auVar43 = vmaxps_avx(auVar47,auVar43);
      auVar47 = vmovshdup_avx(auVar43);
      auVar43 = vmaxss_avx(auVar47,auVar43);
      local_360 = uVar37 + 0xff;
      auVar53 = vmovddup_avx512vl(auVar49);
      auVar49 = vmovddup_avx512vl(auVar50);
      auVar50 = vmovddup_avx512vl(auVar44);
      auVar126._8_8_ = auVar48._0_8_;
      auVar126._0_8_ = auVar48._0_8_;
      local_188 = ZEXT416((uint)(auVar43._0_4_ * 9.536743e-07));
      local_148 = vbroadcastss_avx512vl(local_188);
      auVar43 = vxorps_avx512vl(local_148._0_16_,auVar250._0_16_);
      local_168 = vbroadcastss_avx512vl(auVar43);
      uVar31 = 0;
      auVar43 = vsubps_avx(auVar52,auVar3);
      auVar95._0_16_ = vsubps_avx512vl(local_328,auVar52);
      local_198 = vsubps_avx512vl(_local_178,local_328);
      local_2a8 = vsubps_avx(_local_238,local_228);
      local_2b8 = vsubps_avx512vl(_local_288,local_268);
      local_2c8 = vsubps_avx512vl(_local_298,local_278);
      _local_2d8 = vsubps_avx512vl(_local_258,local_248);
      local_2e8 = vpbroadcastd_avx512vl();
      local_2f8 = vpbroadcastd_avx512vl();
      auVar47 = ZEXT816(0x3f80000000000000);
      auVar51 = auVar47;
LAB_01cfd927:
      auVar44 = vshufps_avx(auVar51,auVar51,0x50);
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = 0x3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      auVar239._16_4_ = 0x3f800000;
      auVar239._0_16_ = auVar236;
      auVar239._20_4_ = 0x3f800000;
      auVar239._24_4_ = 0x3f800000;
      auVar239._28_4_ = 0x3f800000;
      auVar48 = vsubps_avx(auVar236,auVar44);
      fVar114 = auVar44._0_4_;
      fVar120 = auVar45._0_4_;
      auVar143._0_4_ = fVar120 * fVar114;
      fVar202 = auVar44._4_4_;
      fVar121 = auVar45._4_4_;
      auVar143._4_4_ = fVar121 * fVar202;
      fVar211 = auVar44._8_4_;
      auVar143._8_4_ = fVar120 * fVar211;
      fVar212 = auVar44._12_4_;
      auVar143._12_4_ = fVar121 * fVar212;
      fVar122 = auVar46._0_4_;
      auVar149._0_4_ = fVar122 * fVar114;
      fVar136 = auVar46._4_4_;
      auVar149._4_4_ = fVar136 * fVar202;
      auVar149._8_4_ = fVar122 * fVar211;
      auVar149._12_4_ = fVar136 * fVar212;
      fVar123 = auVar125._0_4_;
      auVar159._0_4_ = fVar123 * fVar114;
      fVar128 = auVar125._4_4_;
      auVar159._4_4_ = fVar128 * fVar202;
      auVar159._8_4_ = fVar123 * fVar211;
      auVar159._12_4_ = fVar128 * fVar212;
      fVar129 = auVar115._0_4_;
      auVar131._0_4_ = fVar129 * fVar114;
      fVar130 = auVar115._4_4_;
      auVar131._4_4_ = fVar130 * fVar202;
      auVar131._8_4_ = fVar129 * fVar211;
      auVar131._12_4_ = fVar130 * fVar212;
      auVar54 = vfmadd231ps_avx512vl(auVar143,auVar48,auVar53);
      auVar55 = vfmadd231ps_avx512vl(auVar149,auVar48,auVar49);
      auVar56 = vfmadd231ps_avx512vl(auVar159,auVar48,auVar50);
      auVar48 = vfmadd231ps_fma(auVar131,auVar126,auVar48);
      auVar44 = vmovshdup_avx(auVar47);
      fVar202 = auVar47._0_4_;
      fVar114 = (auVar44._0_4_ - fVar202) * 0.04761905;
      auVar180._4_4_ = fVar202;
      auVar180._0_4_ = fVar202;
      auVar180._8_4_ = fVar202;
      auVar180._12_4_ = fVar202;
      auVar180._16_4_ = fVar202;
      auVar180._20_4_ = fVar202;
      auVar180._24_4_ = fVar202;
      auVar180._28_4_ = fVar202;
      auVar141._0_8_ = auVar44._0_8_;
      auVar141._8_8_ = auVar141._0_8_;
      auVar141._16_8_ = auVar141._0_8_;
      auVar141._24_8_ = auVar141._0_8_;
      auVar75 = vsubps_avx(auVar141,auVar180);
      uVar124 = auVar54._0_4_;
      auVar142._4_4_ = uVar124;
      auVar142._0_4_ = uVar124;
      auVar142._8_4_ = uVar124;
      auVar142._12_4_ = uVar124;
      auVar142._16_4_ = uVar124;
      auVar142._20_4_ = uVar124;
      auVar142._24_4_ = uVar124;
      auVar142._28_4_ = uVar124;
      auVar199._8_4_ = 1;
      auVar199._0_8_ = 0x100000001;
      auVar199._12_4_ = 1;
      auVar199._16_4_ = 1;
      auVar199._20_4_ = 1;
      auVar199._24_4_ = 1;
      auVar199._28_4_ = 1;
      auVar90 = ZEXT1632(auVar54);
      auVar73 = vpermps_avx2(auVar199,auVar90);
      auVar80 = vbroadcastss_avx512vl(auVar55);
      auVar91 = ZEXT1632(auVar55);
      auVar74 = vpermps_avx512vl(auVar199,auVar91);
      auVar81 = vbroadcastss_avx512vl(auVar56);
      auVar71 = ZEXT1632(auVar56);
      auVar82 = vpermps_avx512vl(auVar199,auVar71);
      auVar83 = vbroadcastss_avx512vl(auVar48);
      auVar87 = ZEXT1632(auVar48);
      auVar84 = vpermps_avx512vl(auVar199,auVar87);
      auVar200._4_4_ = fVar114;
      auVar200._0_4_ = fVar114;
      auVar200._8_4_ = fVar114;
      auVar200._12_4_ = fVar114;
      auVar200._16_4_ = fVar114;
      auVar200._20_4_ = fVar114;
      auVar200._24_4_ = fVar114;
      auVar200._28_4_ = fVar114;
      auVar88 = auVar254._0_32_;
      auVar72 = vpermps_avx512vl(auVar88,auVar90);
      auVar170._8_4_ = 3;
      auVar170._0_8_ = 0x300000003;
      auVar170._12_4_ = 3;
      auVar170._16_4_ = 3;
      auVar170._20_4_ = 3;
      auVar170._24_4_ = 3;
      auVar170._28_4_ = 3;
      auVar85 = vpermps_avx512vl(auVar170,auVar90);
      auVar86 = vpermps_avx512vl(auVar88,auVar91);
      auVar90 = vpermps_avx2(auVar170,auVar91);
      auVar70 = vpermps_avx512vl(auVar88,auVar71);
      auVar91 = vpermps_avx2(auVar170,auVar71);
      auVar71 = vpermps_avx512vl(auVar88,auVar87);
      auVar87 = vpermps_avx512vl(auVar170,auVar87);
      auVar44 = vfmadd132ps_fma(auVar75,auVar180,_DAT_01faff20);
      auVar75 = vsubps_avx(auVar239,ZEXT1632(auVar44));
      auVar88 = vmulps_avx512vl(auVar80,ZEXT1632(auVar44));
      auVar92 = ZEXT1632(auVar44);
      auVar89 = vmulps_avx512vl(auVar74,auVar92);
      auVar48 = vfmadd231ps_fma(auVar88,auVar75,auVar142);
      auVar54 = vfmadd231ps_fma(auVar89,auVar75,auVar73);
      auVar88 = vmulps_avx512vl(auVar81,auVar92);
      auVar89 = vmulps_avx512vl(auVar82,auVar92);
      auVar80 = vfmadd231ps_avx512vl(auVar88,auVar75,auVar80);
      auVar74 = vfmadd231ps_avx512vl(auVar89,auVar75,auVar74);
      auVar88 = vmulps_avx512vl(auVar83,auVar92);
      auVar89 = ZEXT1632(auVar44);
      auVar84 = vmulps_avx512vl(auVar84,auVar89);
      auVar81 = vfmadd231ps_avx512vl(auVar88,auVar75,auVar81);
      auVar82 = vfmadd231ps_avx512vl(auVar84,auVar75,auVar82);
      fVar211 = auVar44._0_4_;
      fVar212 = auVar44._4_4_;
      auVar15._4_4_ = fVar212 * auVar80._4_4_;
      auVar15._0_4_ = fVar211 * auVar80._0_4_;
      fVar213 = auVar44._8_4_;
      auVar15._8_4_ = fVar213 * auVar80._8_4_;
      fVar222 = auVar44._12_4_;
      auVar15._12_4_ = fVar222 * auVar80._12_4_;
      auVar15._16_4_ = auVar80._16_4_ * 0.0;
      auVar15._20_4_ = auVar80._20_4_ * 0.0;
      auVar15._24_4_ = auVar80._24_4_ * 0.0;
      auVar15._28_4_ = fVar202;
      auVar16._4_4_ = fVar212 * auVar74._4_4_;
      auVar16._0_4_ = fVar211 * auVar74._0_4_;
      auVar16._8_4_ = fVar213 * auVar74._8_4_;
      auVar16._12_4_ = fVar222 * auVar74._12_4_;
      auVar16._16_4_ = auVar74._16_4_ * 0.0;
      auVar16._20_4_ = auVar74._20_4_ * 0.0;
      auVar16._24_4_ = auVar74._24_4_ * 0.0;
      auVar16._28_4_ = auVar73._28_4_;
      auVar48 = vfmadd231ps_fma(auVar15,auVar75,ZEXT1632(auVar48));
      auVar54 = vfmadd231ps_fma(auVar16,auVar75,ZEXT1632(auVar54));
      auVar134._0_4_ = fVar211 * auVar81._0_4_;
      auVar134._4_4_ = fVar212 * auVar81._4_4_;
      auVar134._8_4_ = fVar213 * auVar81._8_4_;
      auVar134._12_4_ = fVar222 * auVar81._12_4_;
      auVar134._16_4_ = auVar81._16_4_ * 0.0;
      auVar134._20_4_ = auVar81._20_4_ * 0.0;
      auVar134._24_4_ = auVar81._24_4_ * 0.0;
      auVar134._28_4_ = 0;
      auVar17._4_4_ = fVar212 * auVar82._4_4_;
      auVar17._0_4_ = fVar211 * auVar82._0_4_;
      auVar17._8_4_ = fVar213 * auVar82._8_4_;
      auVar17._12_4_ = fVar222 * auVar82._12_4_;
      auVar17._16_4_ = auVar82._16_4_ * 0.0;
      auVar17._20_4_ = auVar82._20_4_ * 0.0;
      auVar17._24_4_ = auVar82._24_4_ * 0.0;
      auVar17._28_4_ = auVar81._28_4_;
      auVar55 = vfmadd231ps_fma(auVar134,auVar75,auVar80);
      auVar56 = vfmadd231ps_fma(auVar17,auVar75,auVar74);
      auVar18._28_4_ = auVar74._28_4_;
      auVar18._0_28_ =
           ZEXT1628(CONCAT412(fVar222 * auVar56._12_4_,
                              CONCAT48(fVar213 * auVar56._8_4_,
                                       CONCAT44(fVar212 * auVar56._4_4_,fVar211 * auVar56._0_4_))));
      auVar64 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar222 * auVar55._12_4_,
                                                   CONCAT48(fVar213 * auVar55._8_4_,
                                                            CONCAT44(fVar212 * auVar55._4_4_,
                                                                     fVar211 * auVar55._0_4_)))),
                                auVar75,ZEXT1632(auVar48));
      auVar65 = vfmadd231ps_fma(auVar18,auVar75,ZEXT1632(auVar54));
      auVar73 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar48));
      auVar80 = vsubps_avx(ZEXT1632(auVar56),ZEXT1632(auVar54));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar73 = vmulps_avx512vl(auVar73,auVar74);
      auVar80 = vmulps_avx512vl(auVar80,auVar74);
      auVar191._0_4_ = fVar114 * auVar73._0_4_;
      auVar191._4_4_ = fVar114 * auVar73._4_4_;
      auVar191._8_4_ = fVar114 * auVar73._8_4_;
      auVar191._12_4_ = fVar114 * auVar73._12_4_;
      auVar191._16_4_ = fVar114 * auVar73._16_4_;
      auVar191._20_4_ = fVar114 * auVar73._20_4_;
      auVar191._24_4_ = fVar114 * auVar73._24_4_;
      auVar191._28_4_ = 0;
      auVar73 = vmulps_avx512vl(auVar200,auVar80);
      auVar54 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
      auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_01feed00,ZEXT1632(auVar54));
      auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_01feed00,ZEXT1632(auVar54));
      auVar135._0_4_ = auVar191._0_4_ + auVar64._0_4_;
      auVar135._4_4_ = auVar191._4_4_ + auVar64._4_4_;
      auVar135._8_4_ = auVar191._8_4_ + auVar64._8_4_;
      auVar135._12_4_ = auVar191._12_4_ + auVar64._12_4_;
      auVar135._16_4_ = auVar191._16_4_ + 0.0;
      auVar135._20_4_ = auVar191._20_4_ + 0.0;
      auVar135._24_4_ = auVar191._24_4_ + 0.0;
      auVar135._28_4_ = 0;
      auVar92 = ZEXT1632(auVar54);
      auVar82 = vpermt2ps_avx512vl(auVar191,_DAT_01feed00,auVar92);
      auVar83 = vaddps_avx512vl(ZEXT1632(auVar65),auVar73);
      auVar84 = vpermt2ps_avx512vl(auVar73,_DAT_01feed00,auVar92);
      auVar73 = vsubps_avx(auVar80,auVar82);
      auVar82 = vsubps_avx512vl(auVar81,auVar84);
      auVar84 = vmulps_avx512vl(auVar86,auVar89);
      auVar88 = vmulps_avx512vl(auVar90,auVar89);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar75,auVar72);
      auVar72 = vfmadd231ps_avx512vl(auVar88,auVar75,auVar85);
      auVar85 = vmulps_avx512vl(auVar70,auVar89);
      auVar88 = vmulps_avx512vl(auVar91,auVar89);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar75,auVar86);
      auVar90 = vfmadd231ps_avx512vl(auVar88,auVar75,auVar90);
      auVar86 = vmulps_avx512vl(auVar71,auVar89);
      auVar71 = vmulps_avx512vl(auVar87,auVar89);
      auVar48 = vfmadd231ps_fma(auVar86,auVar75,auVar70);
      auVar86 = vfmadd231ps_avx512vl(auVar71,auVar75,auVar91);
      auVar70 = vmulps_avx512vl(auVar89,auVar85);
      auVar87 = ZEXT1632(auVar44);
      auVar71 = vmulps_avx512vl(auVar87,auVar90);
      auVar84 = vfmadd231ps_avx512vl(auVar70,auVar75,auVar84);
      auVar72 = vfmadd231ps_avx512vl(auVar71,auVar75,auVar72);
      auVar86 = vmulps_avx512vl(auVar87,auVar86);
      auVar85 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar222 * auVar48._12_4_,
                                              CONCAT48(fVar213 * auVar48._8_4_,
                                                       CONCAT44(fVar212 * auVar48._4_4_,
                                                                fVar211 * auVar48._0_4_)))),auVar75,
                           auVar85);
      auVar90 = vfmadd231ps_avx512vl(auVar86,auVar75,auVar90);
      auVar19._4_4_ = fVar212 * auVar85._4_4_;
      auVar19._0_4_ = fVar211 * auVar85._0_4_;
      auVar19._8_4_ = fVar213 * auVar85._8_4_;
      auVar19._12_4_ = fVar222 * auVar85._12_4_;
      auVar19._16_4_ = auVar85._16_4_ * 0.0;
      auVar19._20_4_ = auVar85._20_4_ * 0.0;
      auVar19._24_4_ = auVar85._24_4_ * 0.0;
      auVar19._28_4_ = auVar91._28_4_;
      auVar91 = vmulps_avx512vl(auVar87,auVar90);
      auVar86 = vfmadd231ps_avx512vl(auVar19,auVar75,auVar84);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar72,auVar75);
      auVar75 = vsubps_avx512vl(auVar85,auVar84);
      auVar90 = vsubps_avx512vl(auVar90,auVar72);
      auVar75 = vmulps_avx512vl(auVar75,auVar74);
      auVar90 = vmulps_avx512vl(auVar90,auVar74);
      fVar202 = fVar114 * auVar75._0_4_;
      fVar211 = fVar114 * auVar75._4_4_;
      auVar20._4_4_ = fVar211;
      auVar20._0_4_ = fVar202;
      fVar212 = fVar114 * auVar75._8_4_;
      auVar20._8_4_ = fVar212;
      fVar213 = fVar114 * auVar75._12_4_;
      auVar20._12_4_ = fVar213;
      fVar222 = fVar114 * auVar75._16_4_;
      auVar20._16_4_ = fVar222;
      fVar223 = fVar114 * auVar75._20_4_;
      auVar20._20_4_ = fVar223;
      fVar114 = fVar114 * auVar75._24_4_;
      auVar20._24_4_ = fVar114;
      auVar20._28_4_ = auVar75._28_4_;
      auVar90 = vmulps_avx512vl(auVar200,auVar90);
      auVar74 = vpermt2ps_avx512vl(auVar86,_DAT_01feed00,auVar92);
      auVar84 = vpermt2ps_avx512vl(auVar91,_DAT_01feed00,auVar92);
      auVar201._0_4_ = auVar86._0_4_ + fVar202;
      auVar201._4_4_ = auVar86._4_4_ + fVar211;
      auVar201._8_4_ = auVar86._8_4_ + fVar212;
      auVar201._12_4_ = auVar86._12_4_ + fVar213;
      auVar201._16_4_ = auVar86._16_4_ + fVar222;
      auVar201._20_4_ = auVar86._20_4_ + fVar223;
      auVar201._24_4_ = auVar86._24_4_ + fVar114;
      auVar201._28_4_ = auVar86._28_4_ + auVar75._28_4_;
      auVar75 = vpermt2ps_avx512vl(auVar20,_DAT_01feed00,ZEXT1632(auVar54));
      auVar72 = vaddps_avx512vl(auVar91,auVar90);
      in_ZMM16 = ZEXT3264(auVar72);
      auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_01feed00,ZEXT1632(auVar54));
      auVar75 = vsubps_avx(auVar74,auVar75);
      auVar90 = vsubps_avx512vl(auVar84,auVar90);
      auVar147 = ZEXT1632(auVar64);
      auVar85 = vsubps_avx512vl(auVar86,auVar147);
      auVar155 = ZEXT1632(auVar65);
      auVar70 = vsubps_avx512vl(auVar91,auVar155);
      auVar71 = vsubps_avx512vl(auVar74,auVar80);
      auVar85 = vaddps_avx512vl(auVar85,auVar71);
      auVar71 = vsubps_avx512vl(auVar84,auVar81);
      auVar70 = vaddps_avx512vl(auVar70,auVar71);
      auVar71 = vmulps_avx512vl(auVar155,auVar85);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar147,auVar70);
      auVar87 = vmulps_avx512vl(auVar83,auVar85);
      auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar135,auVar70);
      auVar88 = vmulps_avx512vl(auVar82,auVar85);
      auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar73,auVar70);
      auVar89 = vmulps_avx512vl(auVar81,auVar85);
      auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar80,auVar70);
      auVar92 = vmulps_avx512vl(auVar91,auVar85);
      auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar86,auVar70);
      auVar93 = vmulps_avx512vl(auVar72,auVar85);
      auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar201,auVar70);
      auVar94 = vmulps_avx512vl(auVar90,auVar85);
      auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar75,auVar70);
      auVar85 = vmulps_avx512vl(auVar84,auVar85);
      auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar74,auVar70);
      auVar70 = vminps_avx512vl(auVar71,auVar87);
      auVar71 = vmaxps_avx512vl(auVar71,auVar87);
      auVar87 = vminps_avx512vl(auVar88,auVar89);
      auVar70 = vminps_avx512vl(auVar70,auVar87);
      auVar87 = vmaxps_avx512vl(auVar88,auVar89);
      auVar71 = vmaxps_avx512vl(auVar71,auVar87);
      auVar87 = vminps_avx512vl(auVar92,auVar93);
      auVar88 = vmaxps_avx512vl(auVar92,auVar93);
      auVar89 = vminps_avx512vl(auVar94,auVar85);
      auVar87 = vminps_avx512vl(auVar87,auVar89);
      auVar70 = vminps_avx512vl(auVar70,auVar87);
      auVar85 = vmaxps_avx512vl(auVar94,auVar85);
      auVar85 = vmaxps_avx512vl(auVar88,auVar85);
      auVar85 = vmaxps_avx512vl(auVar71,auVar85);
      uVar9 = vcmpps_avx512vl(auVar70,local_148,2);
      uVar10 = vcmpps_avx512vl(auVar85,local_168,5);
      bVar29 = (byte)uVar9 & (byte)uVar10 & 0x7f;
      if (bVar29 != 0) {
        auVar85 = vsubps_avx512vl(auVar80,auVar147);
        auVar70 = vsubps_avx512vl(auVar81,auVar155);
        auVar71 = vsubps_avx512vl(auVar74,auVar86);
        auVar85 = vaddps_avx512vl(auVar85,auVar71);
        auVar71 = vsubps_avx512vl(auVar84,auVar91);
        auVar70 = vaddps_avx512vl(auVar70,auVar71);
        auVar71 = vmulps_avx512vl(auVar155,auVar85);
        auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar70,auVar147);
        auVar83 = vmulps_avx512vl(auVar83,auVar85);
        auVar83 = vfnmadd213ps_avx512vl(auVar135,auVar70,auVar83);
        auVar82 = vmulps_avx512vl(auVar82,auVar85);
        auVar82 = vfnmadd213ps_avx512vl(auVar73,auVar70,auVar82);
        auVar73 = vmulps_avx512vl(auVar81,auVar85);
        auVar81 = vfnmadd231ps_avx512vl(auVar73,auVar70,auVar80);
        auVar73 = vmulps_avx512vl(auVar91,auVar85);
        auVar91 = vfnmadd231ps_avx512vl(auVar73,auVar70,auVar86);
        auVar73 = vmulps_avx512vl(auVar72,auVar85);
        auVar72 = vfnmadd213ps_avx512vl(auVar201,auVar70,auVar73);
        auVar73 = vmulps_avx512vl(auVar90,auVar85);
        auVar86 = vfnmadd213ps_avx512vl(auVar75,auVar70,auVar73);
        auVar75 = vmulps_avx512vl(auVar84,auVar85);
        auVar74 = vfnmadd231ps_avx512vl(auVar75,auVar74,auVar70);
        auVar73 = vminps_avx(auVar71,auVar83);
        auVar75 = vmaxps_avx(auVar71,auVar83);
        auVar80 = vminps_avx(auVar82,auVar81);
        auVar80 = vminps_avx(auVar73,auVar80);
        auVar73 = vmaxps_avx(auVar82,auVar81);
        auVar75 = vmaxps_avx(auVar75,auVar73);
        auVar90 = vminps_avx(auVar91,auVar72);
        auVar73 = vmaxps_avx(auVar91,auVar72);
        auVar91 = vminps_avx(auVar86,auVar74);
        auVar90 = vminps_avx(auVar90,auVar91);
        auVar90 = vminps_avx(auVar80,auVar90);
        auVar80 = vmaxps_avx(auVar86,auVar74);
        auVar73 = vmaxps_avx(auVar73,auVar80);
        auVar75 = vmaxps_avx(auVar75,auVar73);
        uVar9 = vcmpps_avx512vl(auVar75,local_168,5);
        uVar10 = vcmpps_avx512vl(auVar90,local_148,2);
        bVar29 = bVar29 & (byte)uVar9 & (byte)uVar10;
        if (bVar29 != 0) {
          auStack_318[uVar31] = (uint)bVar29;
          uVar9 = vmovlps_avx(auVar47);
          (&uStack_128)[uVar31] = uVar9;
          uVar42 = vmovlps_avx(auVar51);
          auStack_58[uVar31] = uVar42;
          uVar31 = (ulong)((int)uVar31 + 1);
        }
      }
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar247 = ZEXT1664(auVar47);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar249 = ZEXT1664(auVar47);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar250 = ZEXT1664(auVar47);
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar248 = ZEXT3264(auVar75);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar251 = ZEXT1664(auVar47);
      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar252 = ZEXT1664(auVar47);
      auVar253 = ZEXT3264(_DAT_01feed20);
      auVar95._16_16_ = DAT_01feed20._16_16_;
      auVar108 = auVar95;
      if ((int)uVar31 != 0) {
        do {
          uVar30 = (int)uVar31 - 1;
          uVar32 = (ulong)uVar30;
          uVar113 = auStack_318[uVar32];
          auVar51._8_8_ = 0;
          auVar51._0_8_ = auStack_58[uVar32];
          uVar42 = 0;
          for (uVar35 = (ulong)uVar113; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000
              ) {
            uVar42 = uVar42 + 1;
          }
          uVar34 = uVar113 - 1 & uVar113;
          bVar40 = uVar34 == 0;
          auStack_318[uVar32] = uVar34;
          if (bVar40) {
            uVar31 = (ulong)uVar30;
          }
          auVar116._8_8_ = 0;
          auVar116._0_8_ = uVar42;
          auVar47 = vpunpcklqdq_avx(auVar116,ZEXT416((int)uVar42 + 1));
          auVar47 = vcvtqq2ps_avx512vl(auVar47);
          auVar47 = vmulps_avx512vl(auVar47,auVar251._0_16_);
          uVar124 = *(undefined4 *)((long)&uStack_128 + uVar32 * 8 + 4);
          auVar11._4_4_ = uVar124;
          auVar11._0_4_ = uVar124;
          auVar11._8_4_ = uVar124;
          auVar11._12_4_ = uVar124;
          auVar44 = vmulps_avx512vl(auVar47,auVar11);
          auVar48 = auVar252._0_16_;
          auVar47 = vsubps_avx512vl(auVar48,auVar47);
          uVar124 = *(undefined4 *)(&uStack_128 + uVar32);
          auVar12._4_4_ = uVar124;
          auVar12._0_4_ = uVar124;
          auVar12._8_4_ = uVar124;
          auVar12._12_4_ = uVar124;
          auVar47 = vfmadd231ps_avx512vl(auVar44,auVar47,auVar12);
          auVar44 = vmovshdup_avx(auVar47);
          fVar114 = auVar44._0_4_ - auVar47._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar114));
          if (uVar113 == 0 || bVar40) goto LAB_01cfd927;
          auVar44 = vshufps_avx(auVar51,auVar51,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar114));
          auVar56 = vsubps_avx512vl(auVar48,auVar44);
          fVar202 = auVar44._0_4_;
          auVar150._0_4_ = fVar202 * fVar120;
          fVar211 = auVar44._4_4_;
          auVar150._4_4_ = fVar211 * fVar121;
          fVar212 = auVar44._8_4_;
          auVar150._8_4_ = fVar212 * fVar120;
          fVar213 = auVar44._12_4_;
          auVar150._12_4_ = fVar213 * fVar121;
          auVar160._0_4_ = fVar202 * fVar122;
          auVar160._4_4_ = fVar211 * fVar136;
          auVar160._8_4_ = fVar212 * fVar122;
          auVar160._12_4_ = fVar213 * fVar136;
          auVar166._0_4_ = fVar202 * fVar123;
          auVar166._4_4_ = fVar211 * fVar128;
          auVar166._8_4_ = fVar212 * fVar123;
          auVar166._12_4_ = fVar213 * fVar128;
          auVar138._0_4_ = fVar202 * fVar129;
          auVar138._4_4_ = fVar211 * fVar130;
          auVar138._8_4_ = fVar212 * fVar129;
          auVar138._12_4_ = fVar213 * fVar130;
          auVar44 = vfmadd231ps_fma(auVar150,auVar56,auVar53);
          auVar54 = vfmadd231ps_fma(auVar160,auVar56,auVar49);
          auVar55 = vfmadd231ps_fma(auVar166,auVar56,auVar50);
          auVar56 = vfmadd231ps_fma(auVar138,auVar126,auVar56);
          auVar148._16_16_ = auVar44;
          auVar148._0_16_ = auVar44;
          auVar156._16_16_ = auVar54;
          auVar156._0_16_ = auVar54;
          auVar164._16_16_ = auVar55;
          auVar164._0_16_ = auVar55;
          auVar73 = vpermps_avx512vl(auVar253._0_32_,ZEXT1632(auVar47));
          auVar75 = vsubps_avx(auVar156,auVar148);
          auVar54 = vfmadd213ps_fma(auVar75,auVar73,auVar148);
          auVar75 = vsubps_avx(auVar164,auVar156);
          auVar64 = vfmadd213ps_fma(auVar75,auVar73,auVar156);
          auVar44 = vsubps_avx(auVar56,auVar55);
          auVar157._16_16_ = auVar44;
          auVar157._0_16_ = auVar44;
          auVar44 = vfmadd213ps_fma(auVar157,auVar73,auVar164);
          auVar75 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar54));
          auVar54 = vfmadd213ps_fma(auVar75,auVar73,ZEXT1632(auVar54));
          auVar75 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar64));
          auVar44 = vfmadd213ps_fma(auVar75,auVar73,ZEXT1632(auVar64));
          auVar75 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar54));
          auVar158 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar75,auVar73);
          auVar75 = vmulps_avx512vl(auVar75,auVar248._0_32_);
          auVar108._16_16_ = auVar75._16_16_;
          fVar202 = fVar114 * 0.33333334;
          auVar167._0_8_ =
               CONCAT44(auVar158._4_4_ + fVar202 * auVar75._4_4_,
                        auVar158._0_4_ + fVar202 * auVar75._0_4_);
          auVar167._8_4_ = auVar158._8_4_ + fVar202 * auVar75._8_4_;
          auVar167._12_4_ = auVar158._12_4_ + fVar202 * auVar75._12_4_;
          auVar151._0_4_ = fVar202 * auVar75._16_4_;
          auVar151._4_4_ = fVar202 * auVar75._20_4_;
          auVar151._8_4_ = fVar202 * auVar75._24_4_;
          auVar151._12_4_ = fVar202 * auVar75._28_4_;
          auVar63 = vsubps_avx((undefined1  [16])0x0,auVar151);
          auVar64 = vshufpd_avx(auVar158,auVar158,3);
          auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar44 = vsubps_avx(auVar64,auVar158);
          auVar54 = vsubps_avx(auVar65,(undefined1  [16])0x0);
          auVar183._0_4_ = auVar44._0_4_ + auVar54._0_4_;
          auVar183._4_4_ = auVar44._4_4_ + auVar54._4_4_;
          auVar183._8_4_ = auVar44._8_4_ + auVar54._8_4_;
          auVar183._12_4_ = auVar44._12_4_ + auVar54._12_4_;
          auVar44 = vshufps_avx(auVar158,auVar158,0xb1);
          auVar54 = vshufps_avx(auVar167,auVar167,0xb1);
          auVar55 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar56 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar237._4_4_ = auVar183._0_4_;
          auVar237._0_4_ = auVar183._0_4_;
          auVar237._8_4_ = auVar183._0_4_;
          auVar237._12_4_ = auVar183._0_4_;
          auVar59 = vshufps_avx(auVar183,auVar183,0x55);
          fVar202 = auVar59._0_4_;
          auVar195._0_4_ = auVar44._0_4_ * fVar202;
          fVar211 = auVar59._4_4_;
          auVar195._4_4_ = auVar44._4_4_ * fVar211;
          fVar212 = auVar59._8_4_;
          auVar195._8_4_ = auVar44._8_4_ * fVar212;
          fVar213 = auVar59._12_4_;
          auVar195._12_4_ = auVar44._12_4_ * fVar213;
          auVar204._0_4_ = auVar54._0_4_ * fVar202;
          auVar204._4_4_ = auVar54._4_4_ * fVar211;
          auVar204._8_4_ = auVar54._8_4_ * fVar212;
          auVar204._12_4_ = auVar54._12_4_ * fVar213;
          auVar215._0_4_ = auVar55._0_4_ * fVar202;
          auVar215._4_4_ = auVar55._4_4_ * fVar211;
          auVar215._8_4_ = auVar55._8_4_ * fVar212;
          auVar215._12_4_ = auVar55._12_4_ * fVar213;
          auVar184._0_4_ = auVar56._0_4_ * fVar202;
          auVar184._4_4_ = auVar56._4_4_ * fVar211;
          auVar184._8_4_ = auVar56._8_4_ * fVar212;
          auVar184._12_4_ = auVar56._12_4_ * fVar213;
          auVar44 = vfmadd231ps_fma(auVar195,auVar237,auVar158);
          auVar54 = vfmadd231ps_fma(auVar204,auVar237,auVar167);
          auVar61 = vfmadd231ps_fma(auVar215,auVar237,auVar63);
          auVar62 = vfmadd231ps_fma(auVar184,(undefined1  [16])0x0,auVar237);
          auVar59 = vshufpd_avx(auVar44,auVar44,1);
          auVar60 = vshufpd_avx(auVar54,auVar54,1);
          auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
          auVar58 = vshufpd_avx512vl(auVar62,auVar62,1);
          auVar55 = vminss_avx(auVar44,auVar54);
          auVar44 = vmaxss_avx(auVar54,auVar44);
          auVar56 = vminss_avx(auVar61,auVar62);
          auVar54 = vmaxss_avx(auVar62,auVar61);
          auVar55 = vminss_avx(auVar55,auVar56);
          auVar44 = vmaxss_avx(auVar54,auVar44);
          auVar56 = vminss_avx(auVar59,auVar60);
          auVar54 = vmaxss_avx(auVar60,auVar59);
          auVar59 = vminss_avx512f(auVar57,auVar58);
          auVar60 = vmaxss_avx512f(auVar58,auVar57);
          auVar54 = vmaxss_avx(auVar60,auVar54);
          auVar108._0_16_ = vminss_avx512f(auVar56,auVar59);
          in_ZMM16 = ZEXT1664(auVar108._0_16_);
          fVar211 = auVar54._0_4_;
          fVar202 = auVar44._0_4_;
          if (0.0001 <= auVar55._0_4_) {
LAB_01cfe057:
            vucomiss_avx512f(auVar108._0_16_);
            bVar41 = fVar211 <= -0.0001;
            bVar39 = -0.0001 < fVar202;
            bVar38 = bVar41;
            if (!bVar41) goto LAB_01cfe0ad;
            uVar9 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar10 = vcmpps_avx512vl(auVar108._0_16_,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar30 = (uint)uVar9 & (uint)uVar10;
            bVar25 = (uVar30 & 1) == 0;
            bVar41 = bVar39 && bVar25;
            bVar38 = bVar39 && (uVar30 & 1) == 0;
            if (bVar39 && bVar25) goto LAB_01cfe0ad;
          }
          else {
            bVar41 = fVar211 == -0.0001;
            bVar38 = NAN(fVar211);
            if (fVar211 <= -0.0001) goto LAB_01cfe057;
LAB_01cfe0ad:
            auVar60 = auVar255._0_16_;
            vcmpss_avx512f(auVar55,auVar60,1);
            uVar9 = vcmpss_avx512f(auVar44,auVar60,1);
            bVar39 = (bool)((byte)uVar9 & 1);
            auVar97._16_16_ = auVar108._16_16_;
            auVar97._0_16_ = auVar256._0_16_;
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar256._0_4_);
            vucomiss_avx512f(auVar96._0_16_);
            bVar38 = (bool)(!bVar41 | bVar38);
            bVar39 = bVar38 == false;
            auVar99._16_16_ = auVar108._16_16_;
            auVar99._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar98._4_28_ = auVar99._4_28_;
            auVar98._0_4_ = (uint)bVar38 * auVar255._0_4_ + (uint)!bVar38 * 0x7f800000;
            auVar59 = auVar98._0_16_;
            auVar101._16_16_ = auVar108._16_16_;
            auVar101._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar100._4_28_ = auVar101._4_28_;
            auVar100._0_4_ = (uint)bVar38 * auVar255._0_4_ + (uint)!bVar38 * -0x800000;
            auVar56 = auVar100._0_16_;
            uVar9 = vcmpss_avx512f(auVar108._0_16_,auVar60,1);
            bVar41 = (bool)((byte)uVar9 & 1);
            auVar103._16_16_ = auVar108._16_16_;
            auVar103._0_16_ = auVar256._0_16_;
            auVar102._4_28_ = auVar103._4_28_;
            auVar102._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * auVar256._0_4_);
            vucomiss_avx512f(auVar102._0_16_);
            if ((bVar38) || (bVar39)) {
              auVar61 = vucomiss_avx512f(auVar55);
              if ((bVar38) || (bVar39)) {
                auVar62 = vxorps_avx512vl(auVar55,auVar250._0_16_);
                auVar55 = vsubss_avx512f(auVar61,auVar55);
                auVar55 = vdivss_avx512f(auVar62,auVar55);
                auVar61 = vsubss_avx512f(ZEXT416(0x3f800000),auVar55);
                auVar61 = vfmadd213ss_avx512f(auVar61,auVar60,auVar55);
                auVar55 = auVar61;
              }
              else {
                auVar61 = vxorps_avx512vl(auVar61,auVar61);
                vucomiss_avx512f(auVar61);
                if ((bVar38) || (auVar55 = ZEXT416(0x3f800000), bVar39)) {
                  auVar61 = ZEXT416(0x7f800000);
                  auVar55 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar59 = vminss_avx512f(auVar59,auVar61);
              auVar56 = vmaxss_avx(auVar55,auVar56);
            }
            auVar256 = ZEXT464(0x3f800000);
            in_ZMM16 = ZEXT1664(auVar3);
            uVar9 = vcmpss_avx512f(auVar54,auVar60,1);
            bVar41 = (bool)((byte)uVar9 & 1);
            auVar54 = auVar256._0_16_;
            fVar212 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * 0x3f800000);
            if ((auVar96._0_4_ != fVar212) || (NAN(auVar96._0_4_) || NAN(fVar212))) {
              if ((fVar211 != fVar202) || (NAN(fVar211) || NAN(fVar202))) {
                auVar44 = vxorps_avx512vl(auVar44,auVar250._0_16_);
                auVar185._0_4_ = auVar44._0_4_ / (fVar211 - fVar202);
                auVar185._4_12_ = auVar44._4_12_;
                auVar44 = vsubss_avx512f(auVar54,auVar185);
                auVar44 = vfmadd213ss_avx512f(auVar44,auVar60,auVar185);
                auVar55 = auVar44;
              }
              else if ((fVar202 != 0.0) ||
                      (auVar44 = auVar54, auVar55 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar202))) {
                auVar44 = SUB6416(ZEXT464(0xff800000),0);
                auVar55 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar59 = vminss_avx(auVar59,auVar55);
              auVar56 = vmaxss_avx(auVar44,auVar56);
            }
            bVar41 = auVar102._0_4_ != fVar212;
            auVar44 = vminss_avx512f(auVar59,auVar54);
            auVar105._16_16_ = auVar108._16_16_;
            auVar105._0_16_ = auVar59;
            auVar104._4_28_ = auVar105._4_28_;
            auVar104._0_4_ = (uint)bVar41 * auVar44._0_4_ + (uint)!bVar41 * auVar59._0_4_;
            auVar44 = vmaxss_avx512f(auVar54,auVar56);
            auVar107._16_16_ = auVar108._16_16_;
            auVar107._0_16_ = auVar56;
            auVar106._4_28_ = auVar107._4_28_;
            auVar106._0_4_ = (uint)bVar41 * auVar44._0_4_ + (uint)!bVar41 * auVar56._0_4_;
            auVar44 = vmaxss_avx512f(auVar60,auVar104._0_16_);
            auVar108._0_16_ = vminss_avx512f(auVar106._0_16_,auVar54);
            if (auVar44._0_4_ <= auVar108._0_4_) {
              auVar61 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar44._0_4_ + -0.1)));
              auVar62 = vminss_avx512f(ZEXT416((uint)(auVar108._0_4_ + 0.1)),auVar54);
              auVar139._0_8_ = auVar158._0_8_;
              auVar139._8_8_ = auVar139._0_8_;
              auVar205._8_8_ = auVar167._0_8_;
              auVar205._0_8_ = auVar167._0_8_;
              auVar216._8_8_ = auVar63._0_8_;
              auVar216._0_8_ = auVar63._0_8_;
              auVar44 = vshufpd_avx(auVar167,auVar167,3);
              auVar55 = vshufpd_avx(auVar63,auVar63,3);
              auVar56 = vshufps_avx(auVar61,auVar62,0);
              auVar60 = vsubps_avx512vl(auVar48,auVar56);
              fVar202 = auVar56._0_4_;
              auVar161._0_4_ = fVar202 * auVar64._0_4_;
              fVar211 = auVar56._4_4_;
              auVar161._4_4_ = fVar211 * auVar64._4_4_;
              fVar212 = auVar56._8_4_;
              auVar161._8_4_ = fVar212 * auVar64._8_4_;
              fVar213 = auVar56._12_4_;
              auVar161._12_4_ = fVar213 * auVar64._12_4_;
              auVar168._0_4_ = fVar202 * auVar44._0_4_;
              auVar168._4_4_ = fVar211 * auVar44._4_4_;
              auVar168._8_4_ = fVar212 * auVar44._8_4_;
              auVar168._12_4_ = fVar213 * auVar44._12_4_;
              auVar241._0_4_ = auVar55._0_4_ * fVar202;
              auVar241._4_4_ = auVar55._4_4_ * fVar211;
              auVar241._8_4_ = auVar55._8_4_ * fVar212;
              auVar241._12_4_ = auVar55._12_4_ * fVar213;
              auVar152._0_4_ = fVar202 * auVar65._0_4_;
              auVar152._4_4_ = fVar211 * auVar65._4_4_;
              auVar152._8_4_ = fVar212 * auVar65._8_4_;
              auVar152._12_4_ = fVar213 * auVar65._12_4_;
              auVar64 = vfmadd231ps_fma(auVar161,auVar60,auVar139);
              auVar65 = vfmadd231ps_fma(auVar168,auVar60,auVar205);
              auVar59 = vfmadd231ps_fma(auVar241,auVar60,auVar216);
              auVar60 = vfmadd231ps_fma(auVar152,auVar60,ZEXT816(0));
              auVar55 = vsubss_avx512f(auVar54,auVar61);
              auVar44 = vmovshdup_avx(auVar51);
              auVar158 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * auVar61._0_4_)),auVar51,
                                         auVar55);
              auVar55 = vsubss_avx512f(auVar54,auVar62);
              auVar57 = vfmadd231ss_fma(ZEXT416((uint)(auVar44._0_4_ * auVar62._0_4_)),auVar51,
                                        auVar55);
              auVar63 = vdivss_avx512f(auVar54,ZEXT416((uint)fVar114));
              auVar44 = vsubps_avx(auVar65,auVar64);
              auVar165 = auVar247._0_16_;
              auVar55 = vmulps_avx512vl(auVar44,auVar165);
              auVar44 = vsubps_avx(auVar59,auVar65);
              auVar56 = vmulps_avx512vl(auVar44,auVar165);
              auVar44 = vsubps_avx(auVar60,auVar59);
              auVar44 = vmulps_avx512vl(auVar44,auVar165);
              auVar51 = vminps_avx(auVar56,auVar44);
              auVar44 = vmaxps_avx(auVar56,auVar44);
              auVar51 = vminps_avx(auVar55,auVar51);
              auVar44 = vmaxps_avx(auVar55,auVar44);
              auVar55 = vshufpd_avx(auVar51,auVar51,3);
              auVar56 = vshufpd_avx(auVar44,auVar44,3);
              auVar51 = vminps_avx(auVar51,auVar55);
              auVar44 = vmaxps_avx(auVar44,auVar56);
              fVar114 = auVar63._0_4_;
              auVar186._0_4_ = auVar51._0_4_ * fVar114;
              auVar186._4_4_ = auVar51._4_4_ * fVar114;
              auVar186._8_4_ = auVar51._8_4_ * fVar114;
              auVar186._12_4_ = auVar51._12_4_ * fVar114;
              auVar176._0_4_ = fVar114 * auVar44._0_4_;
              auVar176._4_4_ = fVar114 * auVar44._4_4_;
              auVar176._8_4_ = fVar114 * auVar44._8_4_;
              auVar176._12_4_ = fVar114 * auVar44._12_4_;
              auVar63 = vdivss_avx512f(auVar54,ZEXT416((uint)(auVar57._0_4_ - auVar158._0_4_)));
              auVar44 = vshufpd_avx(auVar64,auVar64,3);
              auVar51 = vshufpd_avx(auVar65,auVar65,3);
              auVar55 = vshufpd_avx(auVar59,auVar59,3);
              auVar56 = vshufpd_avx(auVar60,auVar60,3);
              auVar44 = vsubps_avx(auVar44,auVar64);
              auVar64 = vsubps_avx(auVar51,auVar65);
              auVar65 = vsubps_avx(auVar55,auVar59);
              auVar56 = vsubps_avx(auVar56,auVar60);
              auVar51 = vminps_avx(auVar44,auVar64);
              auVar44 = vmaxps_avx(auVar44,auVar64);
              auVar55 = vminps_avx(auVar65,auVar56);
              auVar55 = vminps_avx(auVar51,auVar55);
              auVar51 = vmaxps_avx(auVar65,auVar56);
              auVar44 = vmaxps_avx(auVar44,auVar51);
              fVar114 = auVar63._0_4_;
              auVar217._0_4_ = fVar114 * auVar55._0_4_;
              auVar217._4_4_ = fVar114 * auVar55._4_4_;
              auVar217._8_4_ = fVar114 * auVar55._8_4_;
              auVar217._12_4_ = fVar114 * auVar55._12_4_;
              auVar206._0_4_ = fVar114 * auVar44._0_4_;
              auVar206._4_4_ = fVar114 * auVar44._4_4_;
              auVar206._8_4_ = fVar114 * auVar44._8_4_;
              auVar206._12_4_ = fVar114 * auVar44._12_4_;
              auVar56 = vinsertps_avx(auVar47,auVar158,0x10);
              auVar58 = vpermt2ps_avx512vl(auVar47,_DAT_01feecd0,auVar57);
              auVar127._0_4_ = auVar56._0_4_ + auVar58._0_4_;
              auVar127._4_4_ = auVar56._4_4_ + auVar58._4_4_;
              auVar127._8_4_ = auVar56._8_4_ + auVar58._8_4_;
              auVar127._12_4_ = auVar56._12_4_ + auVar58._12_4_;
              auVar13._8_4_ = 0x3f000000;
              auVar13._0_8_ = 0x3f0000003f000000;
              auVar13._12_4_ = 0x3f000000;
              auVar63 = vmulps_avx512vl(auVar127,auVar13);
              auVar51 = vshufps_avx(auVar63,auVar63,0x54);
              uVar124 = auVar63._0_4_;
              auVar132._4_4_ = uVar124;
              auVar132._0_4_ = uVar124;
              auVar132._8_4_ = uVar124;
              auVar132._12_4_ = uVar124;
              auVar64 = vfmadd213ps_avx512vl(auVar43,auVar132,auVar3);
              auVar65 = vfmadd213ps_avx512vl(auVar95._0_16_,auVar132,auVar52);
              auVar55 = vfmadd213ps_fma(local_198,auVar132,local_328);
              auVar44 = vsubps_avx(auVar65,auVar64);
              auVar64 = vfmadd213ps_fma(auVar44,auVar132,auVar64);
              auVar44 = vsubps_avx(auVar55,auVar65);
              auVar44 = vfmadd213ps_fma(auVar44,auVar132,auVar65);
              auVar44 = vsubps_avx(auVar44,auVar64);
              auVar55 = vfmadd231ps_fma(auVar64,auVar44,auVar132);
              auVar59 = vmulps_avx512vl(auVar44,auVar165);
              auVar227._8_8_ = auVar55._0_8_;
              auVar227._0_8_ = auVar55._0_8_;
              auVar44 = vshufpd_avx(auVar55,auVar55,3);
              auVar55 = vshufps_avx(auVar63,auVar63,0x55);
              auVar64 = vsubps_avx(auVar44,auVar227);
              auVar65 = vfmadd231ps_fma(auVar227,auVar55,auVar64);
              auVar242._8_8_ = auVar59._0_8_;
              auVar242._0_8_ = auVar59._0_8_;
              auVar44 = vshufpd_avx(auVar59,auVar59,3);
              auVar44 = vsubps_avx512vl(auVar44,auVar242);
              auVar44 = vfmadd213ps_avx512vl(auVar44,auVar55,auVar242);
              auVar133._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
              auVar133._8_4_ = auVar64._8_4_ ^ 0x80000000;
              auVar133._12_4_ = auVar64._12_4_ ^ 0x80000000;
              auVar55 = vmovshdup_avx512vl(auVar44);
              auVar243._0_8_ = auVar55._0_8_ ^ 0x8000000080000000;
              auVar243._8_4_ = auVar55._8_4_ ^ 0x80000000;
              auVar243._12_4_ = auVar55._12_4_ ^ 0x80000000;
              auVar59 = vmovshdup_avx512vl(auVar64);
              auVar60 = vpermt2ps_avx512vl(auVar243,ZEXT416(5),auVar64);
              auVar66 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
              auVar255 = ZEXT1664(auVar66);
              auVar55 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar55._0_4_ * auVar64._0_4_)),auVar44,
                                            auVar59);
              auVar64 = vpermt2ps_avx512vl(auVar44,SUB6416(ZEXT464(4),0),auVar133);
              auVar153._0_4_ = auVar55._0_4_;
              auVar153._4_4_ = auVar153._0_4_;
              auVar153._8_4_ = auVar153._0_4_;
              auVar153._12_4_ = auVar153._0_4_;
              auVar44 = vdivps_avx(auVar60,auVar153);
              auVar67 = vdivps_avx512vl(auVar64,auVar153);
              fVar114 = auVar65._0_4_;
              auVar55 = vshufps_avx(auVar65,auVar65,0x55);
              auVar228._0_4_ = fVar114 * auVar44._0_4_ + auVar55._0_4_ * auVar67._0_4_;
              auVar228._4_4_ = fVar114 * auVar44._4_4_ + auVar55._4_4_ * auVar67._4_4_;
              auVar228._8_4_ = fVar114 * auVar44._8_4_ + auVar55._8_4_ * auVar67._8_4_;
              auVar228._12_4_ = fVar114 * auVar44._12_4_ + auVar55._12_4_ * auVar67._12_4_;
              auVar61 = vsubps_avx(auVar51,auVar228);
              auVar55 = vmovshdup_avx(auVar44);
              auVar51 = vinsertps_avx(auVar186,auVar217,0x1c);
              auVar244._0_4_ = auVar55._0_4_ * auVar51._0_4_;
              auVar244._4_4_ = auVar55._4_4_ * auVar51._4_4_;
              auVar244._8_4_ = auVar55._8_4_ * auVar51._8_4_;
              auVar244._12_4_ = auVar55._12_4_ * auVar51._12_4_;
              auVar62 = vinsertps_avx512f(auVar176,auVar206,0x1c);
              auVar55 = vmulps_avx512vl(auVar55,auVar62);
              auVar60 = vminps_avx512vl(auVar244,auVar55);
              auVar65 = vmaxps_avx(auVar55,auVar244);
              auVar59 = vmovshdup_avx(auVar67);
              auVar55 = vinsertps_avx(auVar217,auVar186,0x4c);
              auVar218._0_4_ = auVar59._0_4_ * auVar55._0_4_;
              auVar218._4_4_ = auVar59._4_4_ * auVar55._4_4_;
              auVar218._8_4_ = auVar59._8_4_ * auVar55._8_4_;
              auVar218._12_4_ = auVar59._12_4_ * auVar55._12_4_;
              auVar64 = vinsertps_avx(auVar206,auVar176,0x4c);
              auVar207._0_4_ = auVar59._0_4_ * auVar64._0_4_;
              auVar207._4_4_ = auVar59._4_4_ * auVar64._4_4_;
              auVar207._8_4_ = auVar59._8_4_ * auVar64._8_4_;
              auVar207._12_4_ = auVar59._12_4_ * auVar64._12_4_;
              auVar59 = vminps_avx(auVar218,auVar207);
              auVar60 = vaddps_avx512vl(auVar60,auVar59);
              auVar59 = vmaxps_avx(auVar207,auVar218);
              auVar208._0_4_ = auVar65._0_4_ + auVar59._0_4_;
              auVar208._4_4_ = auVar65._4_4_ + auVar59._4_4_;
              auVar208._8_4_ = auVar65._8_4_ + auVar59._8_4_;
              auVar208._12_4_ = auVar65._12_4_ + auVar59._12_4_;
              auVar219._8_8_ = 0x3f80000000000000;
              auVar219._0_8_ = 0x3f80000000000000;
              auVar65 = vsubps_avx(auVar219,auVar208);
              auVar59 = vsubps_avx(auVar219,auVar60);
              auVar60 = vsubps_avx(auVar56,auVar63);
              auVar63 = vsubps_avx(auVar58,auVar63);
              fVar213 = auVar60._0_4_;
              auVar245._0_4_ = fVar213 * auVar65._0_4_;
              fVar222 = auVar60._4_4_;
              auVar245._4_4_ = fVar222 * auVar65._4_4_;
              fVar223 = auVar60._8_4_;
              auVar245._8_4_ = fVar223 * auVar65._8_4_;
              fVar224 = auVar60._12_4_;
              auVar245._12_4_ = fVar224 * auVar65._12_4_;
              auVar68 = vbroadcastss_avx512vl(auVar44);
              auVar51 = vmulps_avx512vl(auVar68,auVar51);
              auVar62 = vmulps_avx512vl(auVar68,auVar62);
              auVar68 = vminps_avx512vl(auVar51,auVar62);
              auVar62 = vmaxps_avx512vl(auVar62,auVar51);
              auVar51 = vbroadcastss_avx512vl(auVar67);
              auVar55 = vmulps_avx512vl(auVar51,auVar55);
              auVar51 = vmulps_avx512vl(auVar51,auVar64);
              auVar64 = vminps_avx512vl(auVar55,auVar51);
              auVar64 = vaddps_avx512vl(auVar68,auVar64);
              auVar60 = vmulps_avx512vl(auVar60,auVar59);
              fVar114 = auVar63._0_4_;
              auVar209._0_4_ = fVar114 * auVar65._0_4_;
              fVar202 = auVar63._4_4_;
              auVar209._4_4_ = fVar202 * auVar65._4_4_;
              fVar211 = auVar63._8_4_;
              auVar209._8_4_ = fVar211 * auVar65._8_4_;
              fVar212 = auVar63._12_4_;
              auVar209._12_4_ = fVar212 * auVar65._12_4_;
              auVar220._0_4_ = fVar114 * auVar59._0_4_;
              auVar220._4_4_ = fVar202 * auVar59._4_4_;
              auVar220._8_4_ = fVar211 * auVar59._8_4_;
              auVar220._12_4_ = fVar212 * auVar59._12_4_;
              auVar51 = vmaxps_avx(auVar51,auVar55);
              auVar177._0_4_ = auVar62._0_4_ + auVar51._0_4_;
              auVar177._4_4_ = auVar62._4_4_ + auVar51._4_4_;
              auVar177._8_4_ = auVar62._8_4_ + auVar51._8_4_;
              auVar177._12_4_ = auVar62._12_4_ + auVar51._12_4_;
              auVar187._8_8_ = 0x3f800000;
              auVar187._0_8_ = 0x3f800000;
              auVar51 = vsubps_avx(auVar187,auVar177);
              auVar55 = vsubps_avx512vl(auVar187,auVar64);
              auVar238._0_4_ = fVar213 * auVar51._0_4_;
              auVar238._4_4_ = fVar222 * auVar51._4_4_;
              auVar238._8_4_ = fVar223 * auVar51._8_4_;
              auVar238._12_4_ = fVar224 * auVar51._12_4_;
              auVar229._0_4_ = fVar213 * auVar55._0_4_;
              auVar229._4_4_ = fVar222 * auVar55._4_4_;
              auVar229._8_4_ = fVar223 * auVar55._8_4_;
              auVar229._12_4_ = fVar224 * auVar55._12_4_;
              auVar178._0_4_ = fVar114 * auVar51._0_4_;
              auVar178._4_4_ = fVar202 * auVar51._4_4_;
              auVar178._8_4_ = fVar211 * auVar51._8_4_;
              auVar178._12_4_ = fVar212 * auVar51._12_4_;
              auVar188._0_4_ = fVar114 * auVar55._0_4_;
              auVar188._4_4_ = fVar202 * auVar55._4_4_;
              auVar188._8_4_ = fVar211 * auVar55._8_4_;
              auVar188._12_4_ = fVar212 * auVar55._12_4_;
              auVar51 = vminps_avx(auVar238,auVar229);
              auVar55 = vminps_avx512vl(auVar178,auVar188);
              in_ZMM16 = ZEXT1664(auVar55);
              auVar64 = vminps_avx512vl(auVar51,auVar55);
              auVar51 = vmaxps_avx(auVar229,auVar238);
              auVar55 = vmaxps_avx(auVar188,auVar178);
              auVar55 = vmaxps_avx(auVar55,auVar51);
              auVar65 = vminps_avx512vl(auVar245,auVar60);
              auVar51 = vminps_avx(auVar209,auVar220);
              auVar51 = vminps_avx(auVar65,auVar51);
              auVar51 = vhaddps_avx(auVar64,auVar51);
              auVar108._0_16_ = vmaxps_avx512vl(auVar60,auVar245);
              auVar64 = vmaxps_avx(auVar220,auVar209);
              auVar64 = vmaxps_avx(auVar64,auVar108._0_16_);
              auVar55 = vhaddps_avx(auVar55,auVar64);
              auVar51 = vshufps_avx(auVar51,auVar51,0xe8);
              auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
              auVar179._0_4_ = auVar51._0_4_ + auVar61._0_4_;
              auVar179._4_4_ = auVar51._4_4_ + auVar61._4_4_;
              auVar179._8_4_ = auVar51._8_4_ + auVar61._8_4_;
              auVar179._12_4_ = auVar51._12_4_ + auVar61._12_4_;
              auVar189._0_4_ = auVar55._0_4_ + auVar61._0_4_;
              auVar189._4_4_ = auVar55._4_4_ + auVar61._4_4_;
              auVar189._8_4_ = auVar55._8_4_ + auVar61._8_4_;
              auVar189._12_4_ = auVar55._12_4_ + auVar61._12_4_;
              auVar51 = vmaxps_avx(auVar56,auVar179);
              auVar55 = vminps_avx(auVar189,auVar58);
              uVar42 = vcmpps_avx512vl(auVar55,auVar51,1);
              if ((uVar42 & 3) == 0) {
                uVar42 = vcmpps_avx512vl(auVar189,auVar58,1);
                uVar9 = vcmpps_avx512vl(auVar47,auVar179,1);
                if (((ushort)uVar9 & (ushort)uVar42 & 1) == 0) {
                  bVar29 = 0;
                }
                else {
                  auVar51 = vmovshdup_avx(auVar179);
                  bVar29 = auVar158._0_4_ < auVar51._0_4_ & (byte)(uVar42 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar31 || uVar113 != 0 && !bVar40) | bVar29) != 1) {
                  auVar51 = vinsertps_avx(auVar158,auVar57,0x10);
                  goto LAB_01cfd927;
                }
                lVar33 = 200;
                do {
                  auVar47 = vsubss_avx512f(auVar54,auVar61);
                  fVar211 = auVar47._0_4_;
                  fVar114 = fVar211 * fVar211 * fVar211;
                  fVar212 = auVar61._0_4_;
                  fVar202 = fVar212 * 3.0 * fVar211 * fVar211;
                  fVar211 = fVar211 * fVar212 * fVar212 * 3.0;
                  auVar144._4_4_ = fVar114;
                  auVar144._0_4_ = fVar114;
                  auVar144._8_4_ = fVar114;
                  auVar144._12_4_ = fVar114;
                  auVar140._4_4_ = fVar202;
                  auVar140._0_4_ = fVar202;
                  auVar140._8_4_ = fVar202;
                  auVar140._12_4_ = fVar202;
                  auVar117._4_4_ = fVar211;
                  auVar117._0_4_ = fVar211;
                  auVar117._8_4_ = fVar211;
                  auVar117._12_4_ = fVar211;
                  fVar212 = fVar212 * fVar212 * fVar212;
                  auVar162._0_4_ = fVar212 * (float)local_178._0_4_;
                  auVar162._4_4_ = fVar212 * (float)local_178._4_4_;
                  auVar162._8_4_ = fVar212 * fStack_170;
                  auVar162._12_4_ = fVar212 * fStack_16c;
                  auVar47 = vfmadd231ps_fma(auVar162,local_328,auVar117);
                  auVar47 = vfmadd231ps_fma(auVar47,auVar52,auVar140);
                  auVar47 = vfmadd231ps_fma(auVar47,auVar3,auVar144);
                  auVar118._8_8_ = auVar47._0_8_;
                  auVar118._0_8_ = auVar47._0_8_;
                  auVar47 = vshufpd_avx(auVar47,auVar47,3);
                  auVar51 = vshufps_avx(auVar61,auVar61,0x55);
                  auVar47 = vsubps_avx(auVar47,auVar118);
                  auVar51 = vfmadd213ps_fma(auVar47,auVar51,auVar118);
                  fVar114 = auVar51._0_4_;
                  auVar47 = vshufps_avx(auVar51,auVar51,0x55);
                  auVar119._0_4_ = auVar44._0_4_ * fVar114 + auVar67._0_4_ * auVar47._0_4_;
                  auVar119._4_4_ = auVar44._4_4_ * fVar114 + auVar67._4_4_ * auVar47._4_4_;
                  auVar119._8_4_ = auVar44._8_4_ * fVar114 + auVar67._8_4_ * auVar47._8_4_;
                  auVar119._12_4_ = auVar44._12_4_ * fVar114 + auVar67._12_4_ * auVar47._12_4_;
                  auVar61 = vsubps_avx(auVar61,auVar119);
                  auVar47 = vandps_avx512vl(auVar51,auVar249._0_16_);
                  auVar108._0_16_ = vprolq_avx512vl(auVar47,0x20);
                  auVar47 = vmaxss_avx(auVar108._0_16_,auVar47);
                  bVar40 = (float)local_188._0_4_ < auVar47._0_4_;
                  if (auVar47._0_4_ < (float)local_188._0_4_) {
                    auVar47 = vucomiss_avx512f(auVar66);
                    if (bVar40) break;
                    auVar44 = vucomiss_avx512f(auVar47);
                    auVar256 = ZEXT1664(auVar44);
                    if (bVar40) break;
                    vmovshdup_avx(auVar47);
                    auVar44 = vucomiss_avx512f(auVar66);
                    if (bVar40) break;
                    auVar51 = vucomiss_avx512f(auVar44);
                    auVar256 = ZEXT1664(auVar51);
                    if (bVar40) break;
                    auVar54 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar63 = vinsertps_avx(auVar54,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar54 = vdpps_avx(auVar63,local_1a8,0x7f);
                    auVar55 = vdpps_avx(auVar63,local_1b8,0x7f);
                    auVar56 = vdpps_avx(auVar63,local_1c8,0x7f);
                    auVar64 = vdpps_avx(auVar63,local_1d8,0x7f);
                    auVar65 = vdpps_avx(auVar63,local_1e8,0x7f);
                    auVar59 = vdpps_avx(auVar63,local_1f8,0x7f);
                    auVar60 = vdpps_avx(auVar63,local_208,0x7f);
                    auVar63 = vdpps_avx(auVar63,local_218,0x7f);
                    auVar61 = vsubss_avx512f(auVar51,auVar44);
                    fVar212 = auVar44._0_4_;
                    auVar44 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar65._0_4_)),auVar61,
                                              auVar54);
                    auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar212)),auVar61,
                                              auVar55);
                    auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar212)),auVar61,
                                              auVar56);
                    auVar56 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar63._0_4_)),auVar61,
                                              auVar64);
                    auVar108._0_16_ = vsubss_avx512f(auVar51,auVar47);
                    auVar190._0_4_ = auVar108._0_4_;
                    fVar114 = auVar190._0_4_ * auVar190._0_4_ * auVar190._0_4_;
                    local_d8 = auVar47._0_4_;
                    fVar202 = local_d8 * 3.0 * auVar190._0_4_ * auVar190._0_4_;
                    fVar211 = auVar190._0_4_ * local_d8 * local_d8 * 3.0;
                    fVar222 = local_d8 * local_d8 * local_d8;
                    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar222 * auVar56._0_4_)),
                                              ZEXT416((uint)fVar211),auVar55);
                    auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar202),auVar54);
                    auVar44 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar114),auVar44);
                    fVar213 = auVar44._0_4_;
                    if ((fVar213 < fVar137) ||
                       (fVar223 = *(float *)(ray + k * 4 + 0x80), fVar223 < fVar213)) break;
                    local_c8 = vshufps_avx(auVar47,auVar47,0x55);
                    auVar51 = vsubps_avx512vl(auVar48,local_c8);
                    fVar224 = local_c8._0_4_;
                    auVar196._0_4_ = fVar224 * (float)local_238._0_4_;
                    fVar225 = local_c8._4_4_;
                    auVar196._4_4_ = fVar225 * (float)local_238._4_4_;
                    fVar233 = local_c8._8_4_;
                    auVar196._8_4_ = fVar233 * fStack_230;
                    fVar234 = local_c8._12_4_;
                    auVar196._12_4_ = fVar234 * fStack_22c;
                    auVar210._0_4_ = fVar224 * (float)local_288._0_4_;
                    auVar210._4_4_ = fVar225 * (float)local_288._4_4_;
                    auVar210._8_4_ = fVar233 * fStack_280;
                    auVar210._12_4_ = fVar234 * fStack_27c;
                    auVar221._0_4_ = fVar224 * (float)local_298._0_4_;
                    auVar221._4_4_ = fVar225 * (float)local_298._4_4_;
                    auVar221._8_4_ = fVar233 * fStack_290;
                    auVar221._12_4_ = fVar234 * fStack_28c;
                    auVar230._0_4_ = fVar224 * (float)local_258._0_4_;
                    auVar230._4_4_ = fVar225 * (float)local_258._4_4_;
                    auVar230._8_4_ = fVar233 * fStack_250;
                    auVar230._12_4_ = fVar234 * fStack_24c;
                    auVar47 = vfmadd231ps_fma(auVar196,auVar51,local_228);
                    auVar44 = vfmadd231ps_fma(auVar210,auVar51,local_268);
                    auVar48 = vfmadd231ps_fma(auVar221,auVar51,local_278);
                    auVar51 = vfmadd231ps_fma(auVar230,auVar51,local_248);
                    auVar47 = vsubps_avx(auVar44,auVar47);
                    auVar44 = vsubps_avx(auVar48,auVar44);
                    auVar48 = vsubps_avx(auVar51,auVar48);
                    auVar231._0_4_ = local_d8 * auVar44._0_4_;
                    auVar231._4_4_ = local_d8 * auVar44._4_4_;
                    auVar231._8_4_ = local_d8 * auVar44._8_4_;
                    auVar231._12_4_ = local_d8 * auVar44._12_4_;
                    auVar190._4_4_ = auVar190._0_4_;
                    auVar190._8_4_ = auVar190._0_4_;
                    auVar190._12_4_ = auVar190._0_4_;
                    auVar47 = vfmadd231ps_fma(auVar231,auVar190,auVar47);
                    auVar197._0_4_ = local_d8 * auVar48._0_4_;
                    auVar197._4_4_ = local_d8 * auVar48._4_4_;
                    auVar197._8_4_ = local_d8 * auVar48._8_4_;
                    auVar197._12_4_ = local_d8 * auVar48._12_4_;
                    auVar44 = vfmadd231ps_fma(auVar197,auVar190,auVar44);
                    auVar198._0_4_ = local_d8 * auVar44._0_4_;
                    auVar198._4_4_ = local_d8 * auVar44._4_4_;
                    auVar198._8_4_ = local_d8 * auVar44._8_4_;
                    auVar198._12_4_ = local_d8 * auVar44._12_4_;
                    auVar47 = vfmadd231ps_fma(auVar198,auVar190,auVar47);
                    auVar108._0_16_ = vmulps_avx512vl(auVar47,auVar165);
                    pGVar5 = (context->scene->geometries).items[uVar36].ptr;
                    if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) break;
                    auVar169._0_4_ = fVar222 * (float)local_2d8._0_4_;
                    auVar169._4_4_ = fVar222 * (float)local_2d8._4_4_;
                    auVar169._8_4_ = fVar222 * fStack_2d0;
                    auVar169._12_4_ = fVar222 * fStack_2cc;
                    auVar163._4_4_ = fVar211;
                    auVar163._0_4_ = fVar211;
                    auVar163._8_4_ = fVar211;
                    auVar163._12_4_ = fVar211;
                    auVar47 = vfmadd132ps_fma(auVar163,auVar169,local_2c8);
                    auVar154._4_4_ = fVar202;
                    auVar154._0_4_ = fVar202;
                    auVar154._8_4_ = fVar202;
                    auVar154._12_4_ = fVar202;
                    auVar47 = vfmadd132ps_fma(auVar154,auVar47,local_2b8);
                    auVar145._4_4_ = fVar114;
                    auVar145._0_4_ = fVar114;
                    auVar145._8_4_ = fVar114;
                    auVar145._12_4_ = fVar114;
                    auVar48 = vfmadd132ps_fma(auVar145,auVar47,local_2a8);
                    auVar47 = vshufps_avx(auVar48,auVar48,0xc9);
                    auVar44 = vshufps_avx(auVar108._0_16_,auVar108._0_16_,0xc9);
                    auVar146._0_4_ = auVar48._0_4_ * auVar44._0_4_;
                    auVar146._4_4_ = auVar48._4_4_ * auVar44._4_4_;
                    auVar146._8_4_ = auVar48._8_4_ * auVar44._8_4_;
                    auVar146._12_4_ = auVar48._12_4_ * auVar44._12_4_;
                    auVar47 = vfmsub231ps_fma(auVar146,auVar108._0_16_,auVar47);
                    local_e8 = auVar47._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar213;
                      uVar124 = vextractps_avx(auVar47,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar124;
                      uVar124 = vextractps_avx(auVar47,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar124;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                      *(float *)(ray + k * 4 + 0xf0) = local_d8;
                      *(float *)(ray + k * 4 + 0x100) = fVar212;
                      *(int *)(ray + k * 4 + 0x110) = (int)local_368;
                      *(uint *)(ray + k * 4 + 0x120) = uVar36;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      break;
                    }
                    auVar44 = vshufps_avx(auVar47,auVar47,0x55);
                    local_f8 = vshufps_avx(auVar47,auVar47,0xaa);
                    local_108[0] = (RTCHitN)auVar44[0];
                    local_108[1] = (RTCHitN)auVar44[1];
                    local_108[2] = (RTCHitN)auVar44[2];
                    local_108[3] = (RTCHitN)auVar44[3];
                    local_108[4] = (RTCHitN)auVar44[4];
                    local_108[5] = (RTCHitN)auVar44[5];
                    local_108[6] = (RTCHitN)auVar44[6];
                    local_108[7] = (RTCHitN)auVar44[7];
                    local_108[8] = (RTCHitN)auVar44[8];
                    local_108[9] = (RTCHitN)auVar44[9];
                    local_108[10] = (RTCHitN)auVar44[10];
                    local_108[0xb] = (RTCHitN)auVar44[0xb];
                    local_108[0xc] = (RTCHitN)auVar44[0xc];
                    local_108[0xd] = (RTCHitN)auVar44[0xd];
                    local_108[0xe] = (RTCHitN)auVar44[0xe];
                    local_108[0xf] = (RTCHitN)auVar44[0xf];
                    uStack_e4 = local_e8;
                    uStack_e0 = local_e8;
                    uStack_dc = local_e8;
                    fStack_d4 = local_d8;
                    fStack_d0 = local_d8;
                    fStack_cc = local_d8;
                    local_b8 = local_2f8._0_8_;
                    uStack_b0 = local_2f8._8_8_;
                    local_a8 = local_2e8;
                    vpcmpeqd_avx2(ZEXT1632(local_2e8),ZEXT1632(local_2e8));
                    uStack_94 = context->user->instID[0];
                    local_98 = uStack_94;
                    uStack_90 = uStack_94;
                    uStack_8c = uStack_94;
                    uStack_88 = context->user->instPrimID[0];
                    uStack_84 = uStack_88;
                    uStack_80 = uStack_88;
                    uStack_7c = uStack_88;
                    *(float *)(ray + k * 4 + 0x80) = fVar213;
                    local_388 = local_308;
                    local_358.valid = (int *)local_388;
                    local_358.geometryUserPtr = pGVar5->userPtr;
                    local_358.context = context->user;
                    local_358.hit = local_108;
                    local_358.N = 4;
                    local_358.ray = (RTCRayN *)ray;
                    if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      local_370 = context;
                      (*pGVar5->intersectionFilterN)(&local_358);
                      auVar47 = vxorps_avx512vl(auVar66,auVar66);
                      auVar255 = ZEXT1664(auVar47);
                      auVar256 = ZEXT464(0x3f800000);
                      auVar253 = ZEXT3264(_DAT_01feed20);
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar252 = ZEXT1664(auVar47);
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar251 = ZEXT1664(auVar47);
                      auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar248 = ZEXT3264(auVar75);
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar250 = ZEXT1664(auVar47);
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar249 = ZEXT1664(auVar47);
                      auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar247 = ZEXT1664(auVar47);
                      auVar108 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar254 = ZEXT3264(auVar108);
                      context = local_370;
                    }
                    auVar47 = auVar255._0_16_;
                    uVar42 = vptestmd_avx512vl(local_388,local_388);
                    if ((uVar42 & 0xf) != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var8)(&local_358);
                        auVar47 = vxorps_avx512vl(auVar47,auVar47);
                        auVar255 = ZEXT1664(auVar47);
                        auVar256 = ZEXT464(0x3f800000);
                        auVar253 = ZEXT3264(_DAT_01feed20);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar252 = ZEXT1664(auVar47);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar251 = ZEXT1664(auVar47);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar248 = ZEXT3264(auVar75);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar250 = ZEXT1664(auVar47);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar249 = ZEXT1664(auVar47);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar247 = ZEXT1664(auVar47);
                        auVar108 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar254 = ZEXT3264(auVar108);
                      }
                      uVar42 = vptestmd_avx512vl(local_388,local_388);
                      uVar42 = uVar42 & 0xf;
                      bVar29 = (byte)uVar42;
                      if (bVar29 != 0) {
                        iVar26 = *(int *)(local_358.hit + 4);
                        iVar27 = *(int *)(local_358.hit + 8);
                        iVar28 = *(int *)(local_358.hit + 0xc);
                        auVar109._16_16_ = auVar108._16_16_;
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar38 = SUB81(uVar42 >> 3,0);
                        *(uint *)(local_358.ray + 0xc0) =
                             (uint)(bVar29 & 1) * *(int *)local_358.hit |
                             (uint)!(bool)(bVar29 & 1) * *(int *)(local_358.ray + 0xc0);
                        *(uint *)(local_358.ray + 0xc4) =
                             (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_358.ray + 0xc4);
                        *(uint *)(local_358.ray + 200) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_358.ray + 200);
                        *(uint *)(local_358.ray + 0xcc) =
                             (uint)bVar38 * iVar28 | (uint)!bVar38 * *(int *)(local_358.ray + 0xcc);
                        iVar26 = *(int *)(local_358.hit + 0x14);
                        iVar27 = *(int *)(local_358.hit + 0x18);
                        iVar28 = *(int *)(local_358.hit + 0x1c);
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar38 = SUB81(uVar42 >> 3,0);
                        *(uint *)(local_358.ray + 0xd0) =
                             (uint)(bVar29 & 1) * *(int *)(local_358.hit + 0x10) |
                             (uint)!(bool)(bVar29 & 1) * *(int *)(local_358.ray + 0xd0);
                        *(uint *)(local_358.ray + 0xd4) =
                             (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_358.ray + 0xd4);
                        *(uint *)(local_358.ray + 0xd8) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_358.ray + 0xd8);
                        *(uint *)(local_358.ray + 0xdc) =
                             (uint)bVar38 * iVar28 | (uint)!bVar38 * *(int *)(local_358.ray + 0xdc);
                        iVar26 = *(int *)(local_358.hit + 0x24);
                        iVar27 = *(int *)(local_358.hit + 0x28);
                        iVar28 = *(int *)(local_358.hit + 0x2c);
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar38 = SUB81(uVar42 >> 3,0);
                        *(uint *)(local_358.ray + 0xe0) =
                             (uint)(bVar29 & 1) * *(int *)(local_358.hit + 0x20) |
                             (uint)!(bool)(bVar29 & 1) * *(int *)(local_358.ray + 0xe0);
                        *(uint *)(local_358.ray + 0xe4) =
                             (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_358.ray + 0xe4);
                        *(uint *)(local_358.ray + 0xe8) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_358.ray + 0xe8);
                        *(uint *)(local_358.ray + 0xec) =
                             (uint)bVar38 * iVar28 | (uint)!bVar38 * *(int *)(local_358.ray + 0xec);
                        iVar26 = *(int *)(local_358.hit + 0x34);
                        iVar27 = *(int *)(local_358.hit + 0x38);
                        iVar28 = *(int *)(local_358.hit + 0x3c);
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        bVar41 = (bool)((byte)(uVar42 >> 2) & 1);
                        bVar38 = SUB81(uVar42 >> 3,0);
                        *(uint *)(local_358.ray + 0xf0) =
                             (uint)(bVar29 & 1) * *(int *)(local_358.hit + 0x30) |
                             (uint)!(bool)(bVar29 & 1) * *(int *)(local_358.ray + 0xf0);
                        *(uint *)(local_358.ray + 0xf4) =
                             (uint)bVar40 * iVar26 | (uint)!bVar40 * *(int *)(local_358.ray + 0xf4);
                        *(uint *)(local_358.ray + 0xf8) =
                             (uint)bVar41 * iVar27 | (uint)!bVar41 * *(int *)(local_358.ray + 0xf8);
                        *(uint *)(local_358.ray + 0xfc) =
                             (uint)bVar38 * iVar28 | (uint)!bVar38 * *(int *)(local_358.ray + 0xfc);
                        iVar26 = *(int *)(local_358.ray + 0x104);
                        iVar27 = *(int *)(local_358.ray + 0x108);
                        iVar28 = *(int *)(local_358.ray + 0x10c);
                        auVar69._0_4_ =
                             (uint)(bVar29 & 1) * *(int *)(local_358.hit + 0x40) |
                             (uint)!(bool)(bVar29 & 1) * *(int *)(local_358.ray + 0x100);
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        auVar69._4_4_ =
                             (uint)bVar40 * *(int *)(local_358.hit + 0x44) | (uint)!bVar40 * iVar26;
                        bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar69._8_4_ =
                             (uint)bVar40 * *(int *)(local_358.hit + 0x48) | (uint)!bVar40 * iVar27;
                        bVar40 = SUB81(uVar42 >> 3,0);
                        auVar69._12_4_ =
                             (uint)bVar40 * *(int *)(local_358.hit + 0x4c) | (uint)!bVar40 * iVar28;
                        auVar109._0_16_ = auVar69;
                        *(undefined1 (*) [16])(local_358.ray + 0x100) = auVar69;
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        uVar113 = bVar40 * auVar69._4_4_ | (uint)!bVar40 * iVar26;
                        auVar21._4_24_ = auVar109._8_24_;
                        auVar21._0_4_ = uVar113;
                        auVar110._0_8_ = auVar21._0_8_ << 0x20;
                        bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar110._8_4_ = bVar40 * auVar69._8_4_ | (uint)!bVar40 * iVar27;
                        bVar40 = SUB81(uVar42 >> 3,0);
                        auVar110._12_4_ = bVar40 * auVar69._12_4_ | (uint)!bVar40 * iVar28;
                        auVar110._16_16_ = auVar109._16_16_;
                        auVar47 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x50));
                        *(undefined1 (*) [16])(local_358.ray + 0x110) = auVar47;
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        uVar113 = bVar40 * uVar113 | (uint)!bVar40 * iVar26;
                        auVar22._4_24_ = auVar110._8_24_;
                        auVar22._0_4_ = uVar113;
                        auVar111._0_8_ = auVar22._0_8_ << 0x20;
                        bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar111._8_4_ = bVar40 * auVar110._8_4_ | (uint)!bVar40 * iVar27;
                        bVar40 = SUB81(uVar42 >> 3,0);
                        auVar111._12_4_ = bVar40 * auVar110._12_4_ | (uint)!bVar40 * iVar28;
                        auVar111._16_16_ = auVar109._16_16_;
                        auVar47 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x60));
                        *(undefined1 (*) [16])(local_358.ray + 0x120) = auVar47;
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        uVar113 = bVar40 * uVar113 | (uint)!bVar40 * iVar26;
                        auVar23._4_24_ = auVar111._8_24_;
                        auVar23._0_4_ = uVar113;
                        auVar112._0_8_ = auVar23._0_8_ << 0x20;
                        bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar112._8_4_ = bVar40 * auVar111._8_4_ | (uint)!bVar40 * iVar27;
                        bVar40 = SUB81(uVar42 >> 3,0);
                        auVar112._12_4_ = bVar40 * auVar111._12_4_ | (uint)!bVar40 * iVar28;
                        auVar112._16_16_ = auVar109._16_16_;
                        auVar47 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x70));
                        *(undefined1 (*) [16])(local_358.ray + 0x130) = auVar47;
                        bVar40 = (bool)((byte)(uVar42 >> 1) & 1);
                        auVar24._4_24_ = auVar112._8_24_;
                        auVar24._0_4_ = bVar40 * uVar113 | (uint)!bVar40 * iVar26;
                        auVar108._0_8_ = auVar24._0_8_ << 0x20;
                        bVar40 = (bool)((byte)(uVar42 >> 2) & 1);
                        auVar108._8_4_ = bVar40 * auVar112._8_4_ | (uint)!bVar40 * iVar27;
                        bVar40 = SUB81(uVar42 >> 3,0);
                        auVar108._12_4_ = bVar40 * auVar112._12_4_ | (uint)!bVar40 * iVar28;
                        auVar108._16_16_ = auVar109._16_16_;
                        auVar47 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_358.hit + 0x80));
                        *(undefined1 (*) [16])(local_358.ray + 0x140) = auVar47;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x80) = fVar223;
                    break;
                  }
                  lVar33 = lVar33 + -1;
                } while (lVar33 != 0);
              }
            }
          }
          if ((uint)uVar31 == 0) break;
        } while( true );
      }
      uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar14._4_4_ = uVar124;
      auVar14._0_4_ = uVar124;
      auVar14._8_4_ = uVar124;
      auVar14._12_4_ = uVar124;
      auVar14._16_4_ = uVar124;
      auVar14._20_4_ = uVar124;
      auVar14._24_4_ = uVar124;
      auVar14._28_4_ = uVar124;
      uVar9 = vcmpps_avx512vl(local_78,auVar14,2);
      uVar36 = (uint)uVar37 & (uint)local_360 & (uint)uVar9;
      uVar37 = (ulong)uVar36;
    } while (uVar36 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }